

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBoolVector *this;
  ImBoolVector *this_00;
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ImWchar IVar7;
  uint uVar8;
  ImFont *pIVar9;
  ImFont *pIVar10;
  undefined8 *puVar11;
  ImFontConfig *pIVar12;
  long lVar13;
  char cVar14;
  char cVar19;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  undefined1 auVar38 [15];
  undefined1 auVar39 [14];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [14];
  undefined1 auVar44 [16];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  stbtt__buf fontdict;
  undefined1 auVar49 [15];
  unkuint9 Var50;
  undefined1 auVar51 [15];
  undefined1 auVar52 [13];
  undefined1 auVar53 [14];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar56 [15];
  unkbyte10 Var57;
  uint6 uVar58;
  undefined1 auVar59 [14];
  undefined1 auVar60 [16];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  stbtt__active_edge **ppsVar63;
  bool bVar64;
  ushort uVar65;
  ushort uVar66;
  short sVar67;
  stbtt_uint32 sVar68;
  uint uVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  uint uVar80;
  void *p;
  ulong uVar81;
  stbtt_uint32 sVar69;
  stbtt_uint32 sVar70;
  stbtt_uint32 sVar71;
  stbtt_uint32 sVar72;
  stbtt_uint32 sVar73;
  stbtt_uint32 sVar74;
  stbtt_uint32 sVar75;
  int *piVar82;
  void *pvVar83;
  void *pvVar84;
  void *pvVar85;
  stbrp_context *ptr;
  uchar *puVar86;
  stbtt__buf *scanline;
  undefined1 auVar87 [8];
  undefined8 *puVar88;
  stbtt__active_edge *psVar89;
  stbtt__buf *psVar90;
  bool bVar91;
  uint uVar92;
  long lVar93;
  ImWchar *pIVar94;
  char *__function;
  int iVar95;
  ulong uVar96;
  long lVar97;
  bool bVar98;
  long lVar99;
  stbtt_fontinfo *psVar100;
  ImFontConfig *pIVar101;
  size_t sVar102;
  float fVar103;
  ushort *puVar104;
  short sVar105;
  stbtt__edge *psVar106;
  ulong uVar107;
  ulong uVar108;
  uint *ptr_00;
  stbrp_node **ppsVar109;
  byte *pbVar110;
  long lVar111;
  stbtt__edge *psVar112;
  int iVar113;
  int iVar114;
  byte *pbVar115;
  ImFontAtlas *atlas_00;
  int bit_n;
  uint uVar116;
  long lVar117;
  byte bVar118;
  char cVar125;
  char cVar126;
  char cVar128;
  ushort uVar127;
  short sVar129;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar130;
  uint uVar135;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  uint uVar136;
  undefined1 auVar134 [16];
  uint uVar137;
  uint uVar141;
  undefined1 auVar138 [16];
  uint uVar142;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  uint uVar143;
  uint uVar147;
  undefined1 in_XMM3 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  uint uVar148;
  undefined1 auVar146 [16];
  uint uVar149;
  float fVar156;
  float fVar157;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar158;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar159;
  float fVar164;
  uint uVar165;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar166;
  float fVar167;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  short sVar168;
  float fVar169;
  float fVar177;
  uint uVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar175 [16];
  float fVar181;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  short sVar188;
  uint uVar198;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  stbtt__buf sVar205;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  stbtt_uint32 fdarrayoff;
  ImVector<stbrp_rect> buf_rects;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0c [12];
  void *__s;
  stbtt_uint32 local_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  ImFontAtlas *local_478;
  ulong local_470;
  undefined1 local_468 [16];
  ImFontConfig *local_450;
  undefined1 local_448 [8];
  stbrp_node *local_440;
  stbtt__edge *local_438;
  float local_42c;
  ulong local_428;
  void *local_420;
  stbtt__active_edge *local_418;
  undefined8 local_410;
  int local_404;
  float local_400;
  uint local_3fc;
  undefined1 local_3f8 [8];
  void *pvStack_3f0;
  undefined1 local_3e8 [16];
  ulong local_3d0;
  int local_3c8;
  float local_3c4;
  long local_3c0;
  stbtt_fontinfo *local_3b8;
  undefined8 *local_3b0;
  long local_3a8;
  void *pvStack_3a0;
  uchar *local_390;
  ulong local_388;
  ulong local_380;
  long local_378;
  float *local_370;
  int local_368;
  uint local_364;
  uint local_360;
  float local_35c;
  float local_358;
  int local_354;
  int local_350;
  int local_34c;
  undefined1 local_348 [16];
  stbrp_context *local_330;
  float *local_328;
  ulong local_320;
  ulong local_318;
  size_t local_310;
  ImFontConfig *local_308;
  long local_300;
  size_t local_2f8;
  size_t local_2f0;
  uchar *local_2e8;
  long local_2e0;
  short *local_2d8;
  long local_2d0;
  stbtt__edge *local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  stbtt__buf local_238 [32];
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined4 uVar170;
  undefined6 uVar171;
  undefined8 uVar172;
  undefined1 auVar173 [12];
  undefined1 auVar174 [14];
  undefined1 auVar176 [16];
  undefined4 uVar189;
  undefined6 uVar190;
  undefined8 uVar191;
  undefined1 auVar192 [12];
  undefined1 auVar193 [14];
  undefined1 auVar197 [16];
  
  local_3e8._8_8_ = local_3e8._0_8_;
  local_498._8_8_ = local_498._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                  ,0x72f,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildRegisterDefaultCustomRects(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  __s = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar8 = (atlas->ConfigData).Size;
  lVar93 = (long)(int)uVar8;
  if (0 < lVar93) {
    uVar81 = 8;
    if (8 < uVar8) {
      uVar81 = (ulong)uVar8;
    }
    __s = ImGui::MemAlloc(uVar81 * 0x110);
  }
  uVar80 = (atlas->Fonts).Size;
  iVar77 = (int)uVar80 >> 0x1f;
  if ((int)uVar80 < 1) {
    local_498._0_8_ = (void *)0x0;
  }
  else {
    uVar81 = 8;
    if (8 < uVar80) {
      uVar81 = (ulong)uVar80;
    }
    local_498._0_8_ = ImGui::MemAlloc(uVar81 << 5);
  }
  local_310 = lVar93 * 0x110;
  memset(__s,0,local_310);
  local_3e8._0_8_ = CONCAT44(iVar77,uVar80) << 5;
  memset((void *)local_498._0_8_,0,local_3e8._0_8_);
  local_478 = atlas;
  if (0 < (atlas->ConfigData).Size) {
    uVar81 = 0;
    if (0 < (int)uVar8) {
      uVar81 = (ulong)uVar8;
    }
    local_348._0_8_ = uVar81;
    lVar111 = 0;
    pvVar85 = __s;
    do {
      if (lVar111 == local_348._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_00158fbf;
      }
      pIVar101 = (local_478->ConfigData).Data;
      pIVar9 = pIVar101[lVar111].DstFont;
      if ((pIVar9 == (ImFont *)0x0) ||
         (pIVar9->ContainerAtlas != local_478 && pIVar9->ContainerAtlas != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                      ,0x747,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)pvVar85 + lVar111 * 0x110 + 0xe0) = 0xffffffff;
      uVar81 = (ulong)(local_478->Fonts).Size;
      if ((long)uVar81 < 1) {
LAB_00159007:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                      ,0x74e,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar101 = pIVar101 + lVar111;
      uVar96 = 0;
      while (pIVar10 = (local_478->Fonts).Data[uVar96], pIVar9 != pIVar10) {
        uVar96 = uVar96 + 1;
        if ((uVar81 <= uVar96) || (pIVar9 == pIVar10)) goto LAB_00159007;
      }
      *(int *)((long)pvVar85 + lVar111 * 0x110 + 0xe0) = (int)uVar96;
      pbVar115 = (byte *)pIVar101->FontData;
      iVar95 = pIVar101->FontNo;
      bVar118 = *pbVar115;
      local_450 = pIVar101;
      if (bVar118 < 0x4f) {
        if (bVar118 == 0) {
          if (pbVar115[1] != 1) goto LAB_0015909d;
        }
        else if ((bVar118 != 0x31) || (pbVar115[1] != 0)) goto LAB_0015909d;
        if ((pbVar115[2] != 0) || (pbVar115[3] != 0)) goto LAB_0015909d;
LAB_00155ae4:
        sVar75 = -(uint)(iVar95 != 0);
      }
      else {
        if (bVar118 == 0x4f) {
          if (((pbVar115[1] != 0x54) || (pbVar115[2] != 0x54)) || (pbVar115[3] != 0x4f))
          goto LAB_0015909d;
          goto LAB_00155ae4;
        }
        if (bVar118 != 0x74) goto LAB_0015909d;
        bVar118 = pbVar115[1];
        if (bVar118 == 0x72) {
          if ((pbVar115[2] != 0x75) || (pbVar115[3] != 0x65)) goto LAB_0015909d;
          goto LAB_00155ae4;
        }
        if (bVar118 != 0x74) {
          if (((bVar118 != 0x79) || (pbVar115[2] != 0x70)) || (pbVar115[3] != 0x31))
          goto LAB_0015909d;
          goto LAB_00155ae4;
        }
        if ((pbVar115[2] != 99) || (pbVar115[3] != 0x66)) goto LAB_0015909d;
        uVar76 = *(uint *)(pbVar115 + 4);
        uVar76 = uVar76 >> 0x18 | (uVar76 & 0xff0000) >> 8 | (uVar76 & 0xff00) << 8 | uVar76 << 0x18
        ;
        if (((uVar76 != 0x20000) && (uVar76 != 0x10000)) ||
           (uVar76 = *(uint *)(pbVar115 + 8),
           (int)(uVar76 >> 0x18 | (uVar76 & 0xff0000) >> 8 | (uVar76 & 0xff00) << 8 | uVar76 << 0x18
                ) <= iVar95)) goto LAB_0015909d;
        uVar76 = *(uint *)(pbVar115 + (long)iVar95 * 4 + 0xc);
        sVar75 = uVar76 >> 0x18 | (uVar76 & 0xff0000) >> 8 | (uVar76 & 0xff00) << 8 | uVar76 << 0x18
        ;
      }
      if ((int)sVar75 < 0) {
LAB_0015909d:
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                      ,0x754,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(byte **)((long)pvVar85 + lVar111 * 0x110 + 8) = pbVar115;
      *(stbtt_uint32 *)((long)pvVar85 + lVar111 * 0x110 + 0x10) = sVar75;
      *(undefined8 *)((long)pvVar85 + lVar111 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)pvVar85 + lVar111 * 0x110 + 0x48) = 0;
      __s = pvVar85;
      sVar68 = stbtt__find_table(pbVar115,sVar75,"cmap");
      sVar69 = stbtt__find_table(pbVar115,sVar75,"loca");
      *(stbtt_uint32 *)((long)pvVar85 + lVar111 * 0x110 + 0x18) = sVar69;
      sVar70 = stbtt__find_table(pbVar115,sVar75,"head");
      *(stbtt_uint32 *)((long)pvVar85 + lVar111 * 0x110 + 0x1c) = sVar70;
      sVar71 = stbtt__find_table(pbVar115,sVar75,"glyf");
      *(stbtt_uint32 *)((long)pvVar85 + lVar111 * 0x110 + 0x20) = sVar71;
      sVar72 = stbtt__find_table(pbVar115,sVar75,"hhea");
      *(stbtt_uint32 *)((long)pvVar85 + lVar111 * 0x110 + 0x24) = sVar72;
      sVar73 = stbtt__find_table(pbVar115,sVar75,"hmtx");
      *(stbtt_uint32 *)((long)pvVar85 + lVar111 * 0x110 + 0x28) = sVar73;
      sVar74 = stbtt__find_table(pbVar115,sVar75,"kern");
      *(stbtt_uint32 *)((long)pvVar85 + lVar111 * 0x110 + 0x2c) = sVar74;
      local_488._0_4_ = sVar75;
      sVar75 = stbtt__find_table(pbVar115,sVar75,"GPOS");
      *(stbtt_uint32 *)((long)pvVar85 + lVar111 * 0x110 + 0x30) = sVar75;
      if ((((sVar68 == 0) || (sVar70 == 0)) || (sVar72 == 0)) || (sVar73 == 0)) {
LAB_001562fa:
        if ((void *)local_498._0_8_ != (void *)0x0) {
          ImGui::MemFree((void *)local_498._0_8_);
        }
        bVar64 = false;
        goto LAB_00158f2a;
      }
      if (sVar71 == 0) {
        local_3a8 = CONCAT44(local_3a8._4_4_,2);
        local_448 = (undefined1  [8])((ulong)local_448 & 0xffffffff00000000);
        local_410._0_4_ = 0;
        local_49c = 0;
        sVar75 = stbtt__find_table(pbVar115,local_488._0_4_,"CFF ");
        if (sVar75 != 0) {
          *(undefined8 *)((long)pvVar85 + lVar111 * 0x110 + 0x90) = 0;
          *(undefined8 *)((long)pvVar85 + lVar111 * 0x110 + 0x98) = 0;
          *(undefined8 *)((long)pvVar85 + lVar111 * 0x110 + 0x80) = 0;
          *(undefined8 *)((long)pvVar85 + lVar111 * 0x110 + 0x88) = 0;
          *(byte **)((long)pvVar85 + lVar111 * 0x110 + 0x40) = pbVar115 + sVar75;
          *(undefined8 *)((long)pvVar85 + lVar111 * 0x110 + 0x48) = 0x2000000000000000;
          local_238[0].data = *(uchar **)((long)pvVar85 + lVar111 * 0x110 + 0x40);
          local_238[0]._8_8_ = *(undefined8 *)((long)pvVar85 + lVar111 * 0x110 + 0x48);
          if (local_238[0].cursor < -2) goto LAB_00159186;
          uVar76 = local_238[0].cursor + 2;
          if (local_238[0].size < (int)uVar76) goto LAB_00159186;
          uVar116 = 0;
          if ((int)uVar76 < local_238[0].size) {
            uVar116 = (uint)local_238[0].data[uVar76];
          }
          if (local_238[0].size < (int)uVar116) goto LAB_00159186;
          local_238[0].cursor = uVar116;
          stbtt__cff_get_index(local_238);
          sVar205 = stbtt__cff_get_index(local_238);
          _local_3f8 = stbtt__cff_index_get(sVar205,0);
          stbtt__cff_get_index(local_238);
          sVar205 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)pvVar85 + lVar111 * 0x110 + 0x60) = sVar205;
          stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x11,1,(stbtt_uint32 *)local_448);
          stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x106,1,(stbtt_uint32 *)&local_3a8);
          stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x124,1,(stbtt_uint32 *)&local_410);
          stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x125,1,&local_49c);
          uVar172 = local_238[0]._8_8_;
          sVar205._4_12_ = in_stack_fffffffffffffb0c;
          sVar205.data._0_4_ = in_stack_fffffffffffffb08;
          fontdict.cursor = uVar80;
          fontdict.data = (uchar *)__s;
          fontdict.size = iVar77;
          sVar205 = stbtt__get_subrs(sVar205,fontdict);
          sVar75 = local_49c;
          *(stbtt__buf *)((long)pvVar85 + lVar111 * 0x110 + 0x70) = sVar205;
          if (((stbtt_uint32)local_3a8 == 2) && (uVar170 = local_448._0_4_, local_448._0_4_ != 0)) {
            iVar95 = SUB84(uVar172,4);
            if ((stbtt_uint32)local_410 != 0) {
              uVar81 = (ulong)local_49c;
              if (uVar81 == 0) goto LAB_001562fa;
              if (((int)(stbtt_uint32)local_410 < 0) ||
                 (SUB84(uVar172,4) < (int)(stbtt_uint32)local_410)) goto LAB_00159186;
              local_238[0].cursor = (stbtt_uint32)local_410;
              sVar205 = stbtt__cff_get_index(local_238);
              *(stbtt__buf *)((long)pvVar85 + lVar111 * 0x110 + 0x80) = sVar205;
              puVar86 = local_238[0].data + uVar81;
              lVar117 = (ulong)(local_238[0].size - sVar75) << 0x20;
              if ((int)(local_238[0].size - sVar75 | sVar75) < 0 || local_238[0].size < (int)sVar75)
              {
                puVar86 = (uchar *)0x0;
                lVar117 = 0;
              }
              *(uchar **)((long)pvVar85 + lVar111 * 0x110 + 0x90) = puVar86;
              *(long *)((long)pvVar85 + lVar111 * 0x110 + 0x98) = lVar117;
              iVar95 = local_238[0].size;
            }
            if (((int)uVar170 < 0) || (iVar95 < (int)uVar170)) {
LAB_00159186:
              __assert_fail("!(o > b->size || o < 0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                            ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
            }
            local_238[0].cursor = uVar170;
            sVar205 = stbtt__cff_get_index(local_238);
            *(stbtt__buf *)((long)pvVar85 + lVar111 * 0x110 + 0x50) = sVar205;
            goto LAB_00155e84;
          }
        }
        goto LAB_001562fa;
      }
      if (sVar69 == 0) goto LAB_001562fa;
LAB_00155e84:
      sVar75 = stbtt__find_table(pbVar115,local_488._0_4_,"maxp");
      if (sVar75 == 0) {
        uVar76 = 0xffff;
      }
      else {
        uVar76 = (uint)(ushort)(*(ushort *)(pbVar115 + (ulong)sVar75 + 4) << 8 |
                               *(ushort *)(pbVar115 + (ulong)sVar75 + 4) >> 8);
      }
      *(uint *)((long)pvVar85 + lVar111 * 0x110 + 0x14) = uVar76;
      uVar65 = *(ushort *)(pbVar115 + (ulong)sVar68 + 2) << 8 |
               *(ushort *)(pbVar115 + (ulong)sVar68 + 2) >> 8;
      *(undefined4 *)((long)pvVar85 + lVar111 * 0x110 + 0x34) = 0;
      if (uVar65 == 0) goto LAB_001562fa;
      uVar76 = sVar68 + 4;
      uVar81 = (ulong)uVar65;
      iVar95 = 0;
      do {
        uVar65 = *(ushort *)(pbVar115 + uVar76) << 8 | *(ushort *)(pbVar115 + uVar76) >> 8;
        if ((uVar65 == 0) ||
           ((uVar65 == 3 &&
            ((uVar65 = *(ushort *)(pbVar115 + (ulong)uVar76 + 2) << 8 |
                       *(ushort *)(pbVar115 + (ulong)uVar76 + 2) >> 8, uVar65 == 10 || (uVar65 == 1)
             ))))) {
          uVar116 = *(uint *)(pbVar115 + (ulong)uVar76 + 4);
          iVar95 = (uVar116 >> 0x18 | (uVar116 & 0xff0000) >> 8 | (uVar116 & 0xff00) << 8 |
                   uVar116 << 0x18) + sVar68;
          *(int *)((long)pvVar85 + lVar111 * 0x110 + 0x34) = iVar95;
        }
        uVar76 = uVar76 + 8;
        uVar81 = uVar81 - 1;
      } while (uVar81 != 0);
      if (iVar95 == 0) goto LAB_001562fa;
      *(uint *)((long)pvVar85 + lVar111 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (pbVar115 + (long)*(int *)((long)pvVar85 + lVar111 * 0x110 + 0x1c) + 0x32
                           ) << 8 |
                         *(ushort *)
                          (pbVar115 + (long)*(int *)((long)pvVar85 + lVar111 * 0x110 + 0x1c) + 0x32)
                         >> 8);
      iVar95 = *(int *)((long)pvVar85 + lVar111 * 0x110 + 0xe0);
      if ((int)uVar80 <= iVar95) goto LAB_001590fa;
      pIVar94 = local_450->GlyphRanges;
      if (pIVar94 == (ImWchar *)0x0) {
        pIVar94 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar85 + lVar111 * 0x110 + 0xd8) = pIVar94;
      IVar7 = *pIVar94;
      while (IVar7 != 0) {
        uVar65 = pIVar94[1];
        if (uVar65 == 0) break;
        uVar76 = *(uint *)((long)pvVar85 + lVar111 * 0x110 + 0xe4);
        uVar116 = (uint)uVar65;
        if ((int)(uint)uVar65 < (int)uVar76) {
          uVar116 = uVar76;
        }
        *(uint *)((long)pvVar85 + lVar111 * 0x110 + 0xe4) = uVar116;
        IVar7 = pIVar94[2];
        pIVar94 = pIVar94 + 2;
      }
      piVar82 = (int *)((long)iVar95 * 0x20 + local_498._0_8_);
      *piVar82 = *piVar82 + 1;
      iVar95 = *(int *)((long)pvVar85 + lVar111 * 0x110 + 0xe4);
      if (iVar95 < piVar82[1]) {
        iVar95 = piVar82[1];
      }
      piVar82[1] = iVar95;
      lVar111 = lVar111 + 1;
      pvVar85 = __s;
    } while (lVar111 < (local_478->ConfigData).Size);
  }
  auVar87 = (undefined1  [8])0;
  if (0 < (int)uVar8) {
    lVar111 = 0;
    auVar87 = (undefined1  [8])0;
    pvVar85 = __s;
    do {
      lVar117 = lVar111 * 0x110;
      iVar77 = *(int *)((long)pvVar85 + lVar117 + 0xe0);
      if ((int)uVar80 <= iVar77) goto LAB_001590fa;
      local_488 = auVar87;
      this_00 = (ImBoolVector *)((long)pvVar85 + lVar117 + 0xf0);
      __s = pvVar85;
      ImBoolVector::Resize(this_00,*(int *)((long)pvVar85 + lVar117 + 0xe4) + 1);
      lVar99 = (long)iVar77 * 0x20 + local_498._0_8_;
      this = (ImBoolVector *)(lVar99 + 0x10);
      if (*(int *)(lVar99 + 0x10) == 0) {
        ImBoolVector::Resize(this,*(int *)(lVar99 + 4) + 1);
      }
      puVar104 = *(ushort **)((long)pvVar85 + lVar117 + 0xd8);
      uVar65 = *puVar104;
      for (; (uVar65 != 0 && (puVar104[1] != 0)); puVar104 = puVar104 + 2) {
        if (uVar65 <= puVar104[1]) {
          uVar76 = (uint)uVar65;
          do {
            bVar64 = ImBoolVector::GetBit(this,uVar76);
            if ((!bVar64) &&
               (iVar77 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)pvVar85 + lVar117 + 8),
                                    *(int *)((long)pvVar85 + lVar117 + 0x34)), iVar77 != 0)) {
              piVar82 = (int *)((long)pvVar85 + lVar117 + 0xe8);
              *piVar82 = *piVar82 + 1;
              *(int *)(lVar99 + 8) = *(int *)(lVar99 + 8) + 1;
              ImBoolVector::SetBit(this_00,uVar76,true);
              ImBoolVector::SetBit(this,uVar76,true);
              auVar131 = _local_488;
              iVar77 = local_488._0_4_;
              local_488._4_4_ = 0;
              local_488._0_4_ = iVar77 + 1;
              _fStack_480 = auVar131._8_8_;
            }
            bVar64 = uVar76 < puVar104[1];
            uVar76 = uVar76 + 1;
          } while (bVar64);
        }
        uVar65 = puVar104[2];
      }
      lVar111 = lVar111 + 1;
      auVar87 = local_488;
      pvVar85 = __s;
    } while (lVar111 != lVar93);
    if (0 < (int)uVar8) {
      lVar111 = 0;
      do {
        lVar117 = lVar111 * 0x110;
        iVar77 = *(int *)((long)pvVar85 + lVar117 + 0xe8);
        __s = pvVar85;
        if (*(int *)((long)pvVar85 + lVar117 + 0x104) < iVar77) {
          pvVar83 = ImGui::MemAlloc((long)iVar77 << 2);
          pvVar84 = *(void **)((long)pvVar85 + lVar117 + 0x108);
          if (pvVar84 != (void *)0x0) {
            memcpy(pvVar83,pvVar84,(long)*(int *)((long)pvVar85 + lVar117 + 0x100) << 2);
            ImGui::MemFree(*(void **)((long)pvVar85 + lVar117 + 0x108));
          }
          *(void **)((long)pvVar85 + lVar117 + 0x108) = pvVar83;
          *(int *)((long)pvVar85 + lVar117 + 0x104) = iVar77;
        }
        lVar99 = (long)*(int *)((long)pvVar85 + lVar117 + 0xf0);
        ptr_00 = *(uint **)((long)pvVar85 + lVar117 + 0xf8);
        if (0 < lVar99) {
          puVar1 = ptr_00 + lVar99;
          iVar77 = 0;
          do {
            uVar76 = *ptr_00;
            if (uVar76 != 0) {
              uVar116 = 0;
              do {
                if ((uVar76 >> (uVar116 & 0x1f) & 1) != 0) {
                  iVar95 = *(int *)((long)pvVar85 + lVar117 + 0x100);
                  if (iVar95 == *(int *)((long)pvVar85 + lVar117 + 0x104)) {
                    if (iVar95 == 0) {
                      iVar78 = 8;
                    }
                    else {
                      iVar78 = iVar95 / 2 + iVar95;
                    }
                    iVar79 = iVar95 + 1;
                    if (iVar95 + 1 < iVar78) {
                      iVar79 = iVar78;
                    }
                    pvVar84 = ImGui::MemAlloc((long)iVar79 << 2);
                    pvVar83 = *(void **)((long)pvVar85 + lVar117 + 0x108);
                    if (pvVar83 != (void *)0x0) {
                      memcpy(pvVar84,pvVar83,(long)*(int *)((long)pvVar85 + lVar117 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)pvVar85 + lVar117 + 0x108));
                    }
                    *(void **)((long)pvVar85 + lVar117 + 0x108) = pvVar84;
                    *(int *)((long)pvVar85 + lVar117 + 0x104) = iVar79;
                    iVar95 = *(int *)((long)pvVar85 + lVar117 + 0x100);
                  }
                  else {
                    pvVar84 = *(void **)((long)pvVar85 + lVar117 + 0x108);
                  }
                  *(uint *)((long)pvVar84 + (long)iVar95 * 4) = iVar77 + uVar116;
                  piVar82 = (int *)((long)pvVar85 + lVar117 + 0x100);
                  *piVar82 = *piVar82 + 1;
                }
                uVar116 = uVar116 + 1;
              } while (uVar116 != 0x20);
            }
            ptr_00 = ptr_00 + 1;
            iVar77 = iVar77 + 0x20;
          } while (ptr_00 < puVar1);
          ptr_00 = *(uint **)((long)pvVar85 + lVar117 + 0xf8);
        }
        if (ptr_00 != (uint *)0x0) {
          *(undefined8 *)((long)pvVar85 + lVar117 + 0xf0) = 0;
          ImGui::MemFree(ptr_00);
          *(undefined8 *)((long)pvVar85 + lVar117 + 0xf8) = 0;
        }
        if (*(int *)((long)pvVar85 + lVar117 + 0x100) != *(int *)((long)pvVar85 + lVar117 + 0xe8)) {
          __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                        ,0x783,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        lVar111 = lVar111 + 1;
        pvVar85 = __s;
      } while (lVar111 != lVar93);
      auVar87 = local_488;
    }
  }
  atlas_00 = local_478;
  uVar172 = local_498._0_8_;
  if ((int)uVar80 < 1) {
    if (local_498._0_8_ == 0) goto LAB_00156369;
  }
  else {
    lVar111 = 0;
    do {
      pvVar85 = *(void **)(uVar172 + 0x18 + lVar111);
      if (pvVar85 != (void *)0x0) {
        *(undefined8 *)(uVar172 + 0x10 + lVar111) = 0;
        ImGui::MemFree(pvVar85);
        *(undefined8 *)(uVar172 + 0x18 + lVar111) = 0;
      }
      lVar111 = lVar111 + 0x20;
    } while (local_3e8._0_8_ != lVar111);
  }
  ImGui::MemFree((void *)local_498._0_8_);
LAB_00156369:
  _local_3f8 = (stbtt__buf)ZEXT816(0);
  local_3a8 = 0;
  pvStack_3a0 = (void *)0x0;
  uVar80 = SUB84(auVar87,0);
  if ((int)uVar80 < 1) {
    local_3f8._0_4_ = uVar80;
    pvVar85 = (void *)0x0;
  }
  else {
    uVar81 = 8;
    if (8 < uVar80) {
      uVar81 = (ulong)auVar87 & 0xffffffff;
    }
    pvVar85 = ImGui::MemAlloc(uVar81 << 4);
    pvStack_3f0 = pvVar85;
    local_3f8._4_4_ = (int)uVar81;
    uVar81 = 8;
    if (8 < uVar80) {
      uVar81 = (ulong)auVar87 & 0xffffffff;
    }
    local_3f8._0_4_ = uVar80;
    pvStack_3a0 = ImGui::MemAlloc(uVar81 * 0x1c);
    local_3a8 = uVar81 << 0x20;
  }
  pvVar84 = pvStack_3a0;
  local_3a8 = CONCAT44(local_3a8._4_4_,uVar80);
  iVar77 = 0;
  memset(pvVar85,0,(long)(int)(uVar80 << 4));
  local_498._0_8_ = pvVar84;
  memset(pvVar84,0,(long)(int)(uVar80 * 0x1c));
  if ((int)uVar8 < 1) {
    fVar130 = 0.0;
  }
  else {
    lVar111 = 0;
    iVar95 = 0;
    iVar78 = 0;
    local_488 = auVar87;
    lVar117 = local_498._0_8_;
    do {
      iVar79 = *(int *)((long)__s + lVar111 * 0x110 + 0xe8);
      if (iVar79 != 0) {
        if (SUB84(auVar87,0) <= iVar95) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_00158fbf;
        }
        psVar100 = (stbtt_fontinfo *)(lVar111 * 0x110 + (long)__s);
        *(void **)&psVar100[1].hmtx = (void *)((long)iVar95 * 0x10 + (long)pvVar85);
        if (SUB84(auVar87,0) <= iVar78) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_00158fbf;
        }
        lVar99 = (long)iVar78 * 0x1c + lVar117;
        *(long *)&psVar100[1].gpos = lVar99;
        if ((atlas_00->ConfigData).Size <= lVar111) goto LAB_00159064;
        pIVar101 = (atlas_00->ConfigData).Data;
        fVar130 = pIVar101[lVar111].SizePixels;
        *(float *)&psVar100[1].userdata = fVar130;
        *(undefined4 *)((long)&psVar100[1].userdata + 4) = 0;
        psVar100[1].data = *(uchar **)&psVar100[1].gsubrs.cursor;
        uVar80 = *(uint *)&psVar100[1].gsubrs.data;
        uVar81 = (ulong)uVar80;
        psVar100[1].fontstart = uVar80;
        *(long *)&psVar100[1].loca = lVar99;
        *(char *)&psVar100[1].glyf = (char)pIVar101[lVar111].OversampleH;
        *(char *)((long)&psVar100[1].glyf + 1) = (char)pIVar101[lVar111].OversampleV;
        if (fVar130 <= 0.0) {
          fVar130 = -fVar130;
          uVar76 = (uint)(ushort)(*(ushort *)(psVar100->data + (long)psVar100->head + 0x12) << 8 |
                                 *(ushort *)(psVar100->data + (long)psVar100->head + 0x12) >> 8);
        }
        else {
          puVar86 = psVar100->data;
          lVar117 = (long)psVar100->hhea;
          uVar76 = ((int)(short)((ushort)puVar86[lVar117 + 4] << 8) | (uint)puVar86[lVar117 + 5]) -
                   ((int)(short)((ushort)puVar86[lVar117 + 6] << 8) | (uint)puVar86[lVar117 + 7]);
          lVar117 = local_498._0_8_;
        }
        fVar130 = fVar130 / (float)(int)uVar76;
        iVar95 = iVar95 + iVar79;
        iVar78 = iVar78 + iVar79;
        if (0 < (int)uVar80) {
          local_3e8._0_4_ = iVar95;
          uVar170 = (undefined4)lVar111;
          uVar189 = (undefined4)((ulong)lVar111 >> 0x20);
          iVar95 = atlas_00->TexGlyphPadding;
          lVar99 = 6;
          lVar117 = 0;
          do {
            if ((int)uVar81 <= lVar117) goto LAB_00158faa;
            iVar79 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar100->data,psVar100->index_map);
            if (iVar79 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                            ,0x7b2,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar100,iVar79,(float)pIVar101[lVar111].OversampleH * fVar130,
                       (float)pIVar101[lVar111].OversampleV * fVar130,fVar130,in_XMM3._0_4_,
                       (int *)local_238,(int *)local_448,(int *)&local_410,(int *)&local_49c);
            uVar80 = (pIVar101[lVar111].OversampleH +
                     (((stbtt_uint32)local_410 + iVar95) - (int)local_238[0].data)) - 1;
            lVar97 = *(long *)&psVar100[1].hmtx;
            *(short *)(lVar97 + -2 + lVar99) = (short)uVar80;
            uVar76 = (pIVar101[lVar111].OversampleV + ((local_49c + iVar95) - local_448._0_4_)) - 1;
            *(short *)(lVar97 + lVar99) = (short)uVar76;
            iVar77 = iVar77 + (uVar76 & 0xffff) * (uVar80 & 0xffff);
            lVar117 = lVar117 + 1;
            uVar81 = (ulong)*(int *)&psVar100[1].gsubrs.data;
            lVar99 = lVar99 + 0x10;
          } while (lVar117 < (long)uVar81);
          lVar111 = CONCAT44(uVar189,uVar170);
          lVar117 = local_498._0_8_;
          atlas_00 = local_478;
          auVar87 = local_488;
          iVar95 = local_3e8._0_4_;
        }
      }
      lVar111 = lVar111 + 1;
    } while (lVar111 != lVar93);
    fVar130 = (float)iVar77;
  }
  atlas_00->TexHeight = 0;
  fVar103 = (float)atlas_00->TexDesiredWidth;
  if ((int)fVar103 < 1) {
    iVar77 = (int)SQRT(fVar130);
    fVar103 = 5.73972e-42;
    if ((iVar77 < 0xb33) && (fVar103 = 2.86986e-42, iVar77 < 0x599)) {
      fVar103 = (float)((uint)(0x2cb < iVar77) * 0x200 + 0x200);
    }
  }
  atlas_00->TexWidth = (int)fVar103;
  uVar80 = atlas_00->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar76 = (int)fVar103 - uVar80;
  local_440 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar76 << 4);
  auVar202 = _DAT_00192540;
  auVar131 = _DAT_0018d860;
  if ((ptr == (stbrp_context *)0x0) || (local_440 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_440 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_440);
    }
    local_440 = (stbrp_node *)0x0;
    uVar80 = 0;
    fVar103 = 0.0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (((int)uVar80 < -0x7fff) || (0xffff < (int)uVar76)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_rectpack.h"
                    ,0x108,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar81 = (ulong)(uVar76 - 1);
    if ((int)uVar76 < 2) {
      uVar81 = 0;
    }
    else {
      uVar96 = (ulong)(uVar76 & 0x7ffffffe);
      lVar111 = uVar81 - 1;
      auVar119._8_4_ = (int)lVar111;
      auVar119._0_8_ = lVar111;
      auVar119._12_4_ = (int)((ulong)lVar111 >> 0x20);
      ppsVar109 = &local_440[1].next;
      auVar119 = auVar119 ^ _DAT_0018d860;
      auVar144._8_4_ = 0xffffffff;
      auVar144._0_8_ = 0xffffffffffffffff;
      auVar144._12_4_ = 0xffffffff;
      auVar133 = _DAT_0018d850;
      do {
        auVar150 = auVar133 ^ auVar131;
        auVar160._0_4_ = -(uint)(auVar119._0_4_ < auVar150._0_4_);
        auVar160._4_4_ = -(uint)(auVar119._4_4_ < auVar150._4_4_);
        auVar160._8_4_ = -(uint)(auVar119._8_4_ < auVar150._8_4_);
        auVar160._12_4_ = -(uint)(auVar119._12_4_ < auVar150._12_4_);
        auVar151._4_4_ = -(uint)(auVar150._4_4_ == auVar119._4_4_);
        auVar151._12_4_ = -(uint)(auVar150._12_4_ == auVar119._12_4_);
        auVar151._0_4_ = auVar151._4_4_;
        auVar151._8_4_ = auVar151._12_4_;
        auVar150._4_4_ = auVar160._4_4_;
        auVar150._0_4_ = auVar160._4_4_;
        auVar150._8_4_ = auVar160._12_4_;
        auVar150._12_4_ = auVar160._12_4_;
        auVar150 = auVar150 | auVar151 & auVar160;
        lVar111 = auVar133._8_8_;
        if ((~auVar150._0_4_ & 1) != 0) {
          ppsVar109[-2] = local_440 + auVar133._0_8_ + 1;
        }
        if (((auVar150 ^ auVar144) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar109 = local_440 + (lVar111 - auVar144._8_8_);
        }
        auVar133._0_8_ = auVar133._0_8_ + auVar202._0_8_;
        auVar133._8_8_ = lVar111 + auVar202._8_8_;
        ppsVar109 = ppsVar109 + 4;
        uVar96 = uVar96 - 2;
      } while (uVar96 != 0);
    }
    local_440[uVar81].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_440;
    ptr->active_head = ptr->extra;
    ptr->width = uVar76;
    ptr->height = 0x8000 - uVar80;
    ptr->num_nodes = uVar76;
    ptr->align = (int)((uVar76 - 1) + uVar76) / (int)uVar76;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)uVar76;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_330 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas_00,ptr);
  if (0 < (int)uVar8) {
    lVar111 = 0;
    pvVar85 = __s;
    do {
      lVar117 = lVar111 * 0x110;
      iVar77 = *(int *)((long)pvVar85 + lVar117 + 0xe8);
      __s = pvVar85;
      if (iVar77 != 0) {
        stbrp_pack_rects(local_330,*(stbrp_rect **)((long)pvVar85 + lVar117 + 200),iVar77);
        lVar99 = (long)*(int *)((long)pvVar85 + lVar117 + 0xe8);
        if (0 < lVar99) {
          lVar117 = *(long *)((long)pvVar85 + lVar117 + 200);
          lVar97 = 0;
          do {
            if (*(int *)(lVar117 + 0xc + lVar97) != 0) {
              iVar77 = (uint)*(ushort *)(lVar117 + 6 + lVar97) +
                       (uint)*(ushort *)(lVar117 + 10 + lVar97);
              if (iVar77 < atlas_00->TexHeight) {
                iVar77 = atlas_00->TexHeight;
              }
              atlas_00->TexHeight = iVar77;
            }
            lVar97 = lVar97 + 0x10;
          } while (lVar99 * 0x10 != lVar97);
        }
      }
      lVar111 = lVar111 + 1;
      pvVar85 = __s;
    } while (lVar111 != lVar93);
  }
  uVar76 = atlas_00->TexHeight;
  if ((atlas_00->Flags & 1) == 0) {
    uVar76 = (int)(uVar76 - 1) >> 1 | uVar76 - 1;
    uVar76 = (int)uVar76 >> 2 | uVar76;
    uVar76 = (int)uVar76 >> 4 | uVar76;
    uVar76 = (int)uVar76 >> 8 | uVar76;
    uVar76 = (int)uVar76 >> 0x10 | uVar76;
  }
  iVar77 = uVar76 + 1;
  atlas_00->TexHeight = iVar77;
  auVar131._0_4_ = (float)atlas_00->TexWidth;
  auVar131._4_4_ = (float)iVar77;
  auVar131._8_8_ = 0;
  auVar131 = divps(_DAT_0018d890,auVar131);
  atlas_00->TexUvScale = auVar131._0_8_;
  puVar86 = (uchar *)ImGui::MemAlloc((long)(iVar77 * atlas_00->TexWidth));
  atlas_00->TexPixelsAlpha8 = puVar86;
  local_42c = fVar103;
  memset(puVar86,0,(long)atlas_00->TexHeight * (long)atlas_00->TexWidth);
  if (0 < (int)uVar8) {
    local_390 = atlas_00->TexPixelsAlpha8;
    lVar117 = (long)(int)local_42c;
    local_298 = pshuflw(ZEXT416(uVar80),ZEXT416(uVar80),0);
    lVar111 = 0;
    auVar131 = _DAT_00192600;
    do {
      auVar202 = _local_488;
      local_3c0 = lVar111;
      if ((atlas_00->ConfigData).Size <= lVar111) goto LAB_00159064;
      if (*(int *)((long)__s + lVar111 * 0x110 + 0xe8) != 0) {
        psVar100 = (stbtt_fontinfo *)(lVar111 * 0x110 + (long)__s);
        fVar130 = *(float *)&psVar100[1].userdata;
        auVar152 = ZEXT416((uint)fVar130);
        if (fVar130 <= 0.0) {
          auVar152._0_4_ = -fVar130;
          auVar152._4_4_ = 0x80000000;
          auVar152._8_4_ = 0x80000000;
          auVar152._12_4_ = 0x80000000;
          uVar80 = (uint)(ushort)(*(ushort *)(psVar100->data + (long)psVar100->head + 0x12) << 8 |
                                 *(ushort *)(psVar100->data + (long)psVar100->head + 0x12) >> 8);
        }
        else {
          puVar86 = psVar100->data;
          lVar111 = (long)psVar100->hhea;
          uVar80 = ((int)(short)((ushort)puVar86[lVar111 + 4] << 8) | (uint)puVar86[lVar111 + 5]) -
                   ((int)(short)((ushort)puVar86[lVar111 + 6] << 8) | (uint)puVar86[lVar111 + 7]);
        }
        auVar153._4_12_ = auVar152._4_12_;
        auVar153._0_4_ = auVar152._0_4_ / (float)(int)uVar80;
        local_308 = (atlas_00->ConfigData).Data;
        iVar77 = psVar100[1].fontstart;
        if (0 < iVar77) {
          lVar111._0_4_ = psVar100[1].hmtx;
          lVar111._4_4_ = psVar100[1].kern;
          uVar81._0_4_ = psVar100[1].glyf;
          uVar81._4_4_ = psVar100[1].hhea;
          auVar38._8_6_ = 0;
          auVar38._0_8_ = uVar81;
          auVar38[0xe] = (char)((uint)uVar81._4_4_ >> 0x18);
          auVar40._8_4_ = 0;
          auVar40._0_8_ = uVar81;
          auVar40[0xc] = (char)((uint)uVar81._4_4_ >> 0x10);
          auVar40._13_2_ = auVar38._13_2_;
          auVar41._8_4_ = 0;
          auVar41._0_8_ = uVar81;
          auVar41._12_3_ = auVar40._12_3_;
          auVar42._8_2_ = 0;
          auVar42._0_8_ = uVar81;
          auVar42[10] = (char)((uint)uVar81._4_4_ >> 8);
          auVar42._11_4_ = auVar41._11_4_;
          auVar45._8_2_ = 0;
          auVar45._0_8_ = uVar81;
          auVar45._10_5_ = auVar42._10_5_;
          auVar46[8] = (char)uVar81._4_4_;
          auVar46._0_8_ = uVar81;
          auVar46._9_6_ = auVar45._9_6_;
          auVar49._7_8_ = 0;
          auVar49._0_7_ = auVar46._8_7_;
          cVar128 = (char)((uint)(undefined4)uVar81 >> 0x18);
          Var50 = CONCAT81(SUB158(auVar49 << 0x40,7),cVar128);
          auVar56._9_6_ = 0;
          auVar56._0_9_ = Var50;
          cVar126 = (char)((uint)(undefined4)uVar81 >> 0x10);
          auVar47[4] = cVar126;
          auVar47._0_4_ = (undefined4)uVar81;
          auVar47._5_10_ = SUB1510(auVar56 << 0x30,5);
          auVar51._11_4_ = 0;
          auVar51._0_11_ = auVar47._4_11_;
          cVar125 = (char)((uint)(undefined4)uVar81 >> 8);
          auVar52._1_12_ = SUB1512(auVar51 << 0x20,3);
          auVar52[0] = cVar125;
          bVar118 = (byte)(undefined4)uVar81;
          uVar65 = CONCAT11(0,bVar118);
          auVar48._2_13_ = auVar52;
          auVar48._0_2_ = uVar65;
          uVar127 = auVar52._0_2_;
          sVar105 = -auVar47._4_2_;
          sVar129 = (short)Var50;
          sVar67 = -sVar129;
          local_470 = (ulong)uVar127;
          auVar39._10_2_ = 0;
          auVar39._0_10_ = auVar48._0_10_;
          auVar39._12_2_ = sVar129;
          uVar58 = CONCAT42(auVar39._10_4_,auVar47._4_2_);
          auVar53._6_8_ = 0;
          auVar53._0_6_ = uVar58;
          auVar43._4_2_ = uVar127;
          auVar43._0_4_ = auVar48._0_4_;
          auVar43._6_8_ = SUB148(auVar53 << 0x40,6);
          auVar120._0_4_ = (float)uVar65;
          auVar120._4_4_ = (float)auVar43._4_4_;
          auVar120._8_4_ = (float)(int)uVar58;
          auVar120._12_4_ = (float)(auVar39._10_4_ >> 0x10);
          local_268 = divps(_DAT_0018d890,auVar120);
          auVar161[0] = -(bVar118 == 0);
          auVar161[1] = -(bVar118 == 0);
          auVar161[2] = -(bVar118 == 0);
          auVar161[3] = -(bVar118 == 0);
          auVar161[4] = -(cVar125 == '\0');
          auVar161[5] = -(cVar125 == '\0');
          auVar161[6] = -(cVar125 == '\0');
          auVar161[7] = -(cVar125 == '\0');
          auVar161[8] = -(cVar126 == '\0');
          auVar161[9] = -(cVar126 == '\0');
          auVar161[10] = -(cVar126 == '\0');
          auVar161[0xb] = -(cVar126 == '\0');
          auVar161[0xc] = -(cVar128 == '\0');
          auVar161[0xd] = -(cVar128 == '\0');
          auVar161[0xe] = -(cVar128 == '\0');
          auVar161[0xf] = -(cVar128 == '\0');
          Var57 = CONCAT64(CONCAT42(CONCAT22(sVar67,sVar67),sVar105),CONCAT22(sVar105,sVar67));
          auVar54._4_8_ = (long)((unkuint10)Var57 >> 0x10);
          auVar54._2_2_ = 1 - uVar127;
          auVar54._0_2_ = 1 - uVar127;
          auVar132._0_4_ = (float)(int)(short)(1 - uVar65);
          auVar132._4_4_ = (float)(auVar54._0_4_ >> 0x10);
          auVar132._8_4_ = (float)((int)((unkuint10)Var57 >> 0x10) >> 0x10);
          auVar132._12_4_ = (float)(int)sVar67;
          auVar145._0_4_ = auVar153._0_4_ * auVar120._0_4_;
          auVar145._4_4_ = auVar153._0_4_ * auVar120._4_4_;
          auVar145._8_4_ = auVar153._0_4_ * auVar120._8_4_;
          auVar145._12_4_ = auVar153._0_4_ * auVar120._12_4_;
          auVar121._0_4_ = auVar120._0_4_ + auVar120._0_4_;
          auVar121._4_4_ = auVar120._4_4_ + auVar120._4_4_;
          auVar121._8_4_ = auVar120._8_4_ + auVar120._8_4_;
          auVar121._12_4_ = auVar120._12_4_ + auVar120._12_4_;
          auVar133 = divps(auVar132,auVar121);
          fVar130 = auVar145._4_4_;
          if (auVar145._0_4_ <= auVar145._4_4_) {
            fVar130 = auVar145._0_4_;
          }
          local_3c4 = (0.35 / fVar130) * (0.35 / fVar130);
          local_2b8 = auVar145._4_4_;
          fStack_2b4 = auVar145._4_4_;
          fStack_2b0 = auVar145._4_4_;
          fStack_2ac = auVar145._4_4_;
          local_318 = (ulong)((undefined4)uVar81 & 0xff);
          local_320 = (ulong)((uint)(undefined4)uVar81 >> 8 & 0xff);
          local_278._4_4_ = local_268._4_4_;
          local_278._0_4_ = local_278._4_4_;
          local_278._8_4_ = local_278._4_4_;
          local_278._12_4_ = local_278._4_4_;
          local_258 = ~auVar161 & auVar133;
          local_288._4_4_ = SUB164(~auVar161 & auVar133,4);
          local_288._0_4_ = local_288._4_4_;
          local_288._8_4_ = local_288._4_4_;
          local_288._12_4_ = local_288._4_4_;
          local_488._4_4_ = 0;
          local_488._0_4_ = auVar48._0_4_ & 0xff;
          _fStack_480 = auVar202._8_8_;
          local_2a8 = auVar145;
          uVar81 = CONCAT44(auVar145._4_4_,auVar145._0_4_);
          local_248 = uVar81 ^ 0x8000000000000000;
          fStack_240 = auVar145._0_4_;
          fStack_23c = -auVar145._4_4_;
          lVar99 = 0;
          local_3b8 = psVar100;
          local_2e0 = lVar111;
          local_468 = auVar153;
          do {
            if (((*(int *)(lVar111 + 0xc + lVar99 * 0x10) != 0) &&
                (lVar97 = lVar99 * 0x10 + lVar111, *(short *)(lVar97 + 4) != 0)) &&
               (*(short *)(lVar97 + 6) != 0)) {
              local_2d8 = (short *)(lVar99 * 0x1c + *(long *)&psVar100[1].loca);
              local_2d0 = lVar99;
              iVar95 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar100->data,psVar100->index_map);
              uVar172 = *(undefined8 *)(lVar97 + 4);
              *(ulong *)(lVar97 + 4) =
                   CONCAT44(CONCAT22((short)((ulong)uVar172 >> 0x30) + local_298._6_2_,
                                     (short)((ulong)uVar172 >> 0x20) + local_298._4_2_),
                            CONCAT22((short)((ulong)uVar172 >> 0x10) - local_298._2_2_,
                                     (short)uVar172 - local_298._0_2_));
              puVar86 = psVar100->data;
              uVar65 = *(ushort *)(puVar86 + (long)psVar100->hhea + 0x22) << 8 |
                       *(ushort *)(puVar86 + (long)psVar100->hhea + 0x22) >> 8;
              iVar77 = psVar100->hmtx;
              lVar111 = (ulong)uVar65 * 4 + (long)iVar77 + -4;
              lVar99 = (ulong)uVar65 * 4 + (long)iVar77 + -3;
              if (iVar95 < (int)(uint)uVar65) {
                lVar111 = (long)(iVar95 * 4) + (long)iVar77;
                lVar99 = (long)(iVar95 * 4) + 1 + (long)iVar77;
              }
              local_364 = (uint)puVar86[lVar99];
              local_360 = (uint)puVar86[lVar111];
              auVar131 = local_298;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar100,iVar95,(float)local_2a8._0_4_,local_2b8,local_298._0_4_,
                         auVar145._0_4_,&local_350,&local_354,&local_2bc,&local_2c0);
              fVar130 = auVar131._0_4_;
              uVar65 = *(ushort *)(lVar97 + 8);
              uVar127 = *(ushort *)(lVar97 + 10);
              local_428 = (ulong)*(ushort *)(lVar97 + 4);
              local_3d0 = (ulong)*(ushort *)(lVar97 + 6);
              local_378 = lVar97;
              uVar80 = stbtt_GetGlyphShape(psVar100,iVar95,(stbtt_vertex **)&local_410);
              uVar76 = ((int)local_428 - local_488._0_4_) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_3b8,iVar95,(float)local_2a8._0_4_,local_2b8,fVar130,auVar145._0_4_,
                         (int *)&local_49c,&local_34c,(int *)0x0,(int *)0x0);
              local_3fc = uVar76;
              if (uVar76 != 0) {
                iVar77 = ((int)local_3d0 - (int)local_470) + 1;
                if ((iVar77 != 0) && (0 < (int)uVar80)) {
                  local_2e8 = local_390 + (ulong)uVar127 * lVar117 + (ulong)uVar65;
                  local_428 = (ulong)(uint)((int)local_428 - local_488._0_4_);
                  local_3d0 = (ulong)(uint)((int)local_3d0 - (int)local_470);
                  lVar111 = CONCAT44(local_410._4_4_,(stbtt_uint32)local_410);
                  local_498._0_4_ = local_49c;
                  local_404 = local_34c;
                  lVar99 = 0;
                  uVar76 = 0;
                  do {
                    uVar76 = uVar76 + (*(char *)(lVar111 + 0xc + lVar99) == '\x01');
                    lVar99 = lVar99 + 0xe;
                  } while ((ulong)uVar80 * 0xe != lVar99);
                  if ((uVar76 != 0) &&
                     (local_420 = ImGui::MemAlloc((ulong)uVar76 * 4), local_420 != (void *)0x0)) {
                    uVar170 = 0;
                    bVar91 = false;
                    iVar78 = 0;
                    local_450 = (ImFontConfig *)0x0;
                    iVar95 = 0;
                    bVar64 = true;
                    do {
                      bVar98 = bVar64;
                      if ((bVar91) &&
                         (local_450 = (ImFontConfig *)ImGui::MemAlloc((long)iVar95 << 3),
                         local_450 == (ImFontConfig *)0x0)) {
                        ImGui::MemFree((void *)0x0);
                        ImGui::MemFree(local_420);
                        goto LAB_00157e57;
                      }
                      local_238[0].data = (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                      fVar130 = 0.0;
                      fVar103 = 0.0;
                      uVar116 = 0xffffffff;
                      lVar99 = 0;
                      do {
                        iVar95 = (int)local_238[0].data;
                        switch(*(undefined1 *)(lVar111 + 0xc + lVar99)) {
                        case 1:
                          if (-1 < (int)uVar116) {
                            *(int *)((long)local_420 + (ulong)uVar116 * 4) =
                                 (int)local_238[0].data - iVar78;
                          }
                          uVar116 = uVar116 + 1;
                          auVar131 = pshuflw(ZEXT416(*(uint *)(lVar111 + lVar99)),
                                             ZEXT416(*(uint *)(lVar111 + lVar99)),0x60);
                          fVar130 = (float)(auVar131._0_4_ >> 0x10);
                          fVar103 = (float)(auVar131._4_4_ >> 0x10);
                          local_238[0].data =
                               (uchar *)CONCAT44(local_238[0].data._4_4_,(int)local_238[0].data + 1)
                          ;
                          iVar78 = iVar95;
                          if (local_450 != (ImFontConfig *)0x0) {
                            *(float *)(local_450->Name + (long)iVar95 * 8 + -0x54) = fVar130;
                            *(float *)(local_450->Name + (long)iVar95 * 8 + -0x54 + 4) = fVar103;
                          }
                          break;
                        case 2:
                          lVar97 = (long)(int)local_238[0].data;
                          auVar131 = pshuflw(ZEXT416(*(uint *)(lVar111 + lVar99)),
                                             ZEXT416(*(uint *)(lVar111 + lVar99)),0x60);
                          fVar130 = (float)(auVar131._0_4_ >> 0x10);
                          fVar103 = (float)(auVar131._4_4_ >> 0x10);
                          local_238[0].data =
                               (uchar *)CONCAT44(local_238[0].data._4_4_,(int)local_238[0].data + 1)
                          ;
                          if (local_450 != (ImFontConfig *)0x0) {
                            *(float *)(local_450->Name + lVar97 * 8 + -0x54) = fVar130;
                            *(float *)(local_450->Name + lVar97 * 8 + -0x54 + 4) = fVar103;
                          }
                          break;
                        case 3:
                          fVar156 = (float)(int)*(short *)(lVar111 + 6 + lVar99);
                          auVar145 = ZEXT416((uint)fVar156);
                          stbtt__tesselate_curve
                                    ((stbtt__point *)local_450,(int *)local_238,fVar130,fVar103,
                                     (float)(int)*(short *)(lVar111 + 4 + lVar99),fVar156,
                                     (float)(int)*(short *)(lVar111 + lVar99),
                                     (float)(int)*(short *)(lVar111 + 2 + lVar99),local_3c4,0);
                          goto LAB_00157114;
                        case 4:
                          fVar156 = (float)(int)*(short *)(lVar111 + 6 + lVar99);
                          auVar145 = ZEXT416((uint)fVar156);
                          stbtt__tesselate_cubic
                                    ((stbtt__point *)local_450,(int *)local_238,fVar130,fVar103,
                                     (float)(int)*(short *)(lVar111 + 4 + lVar99),fVar156,
                                     (float)(int)*(short *)(lVar111 + 8 + lVar99),
                                     (float)(int)*(short *)(lVar111 + 10 + lVar99),
                                     (float)(int)*(short *)(lVar111 + lVar99),
                                     (float)(int)*(short *)(lVar111 + 2 + lVar99),local_3c4,0);
LAB_00157114:
                          auVar131 = pshuflw(ZEXT416(*(uint *)(lVar111 + lVar99)),
                                             ZEXT416(*(uint *)(lVar111 + lVar99)),0x60);
                          fVar130 = (float)(auVar131._0_4_ >> 0x10);
                          fVar103 = (float)(auVar131._4_4_ >> 0x10);
                        }
                        pIVar101 = local_450;
                        lVar99 = lVar99 + 0xe;
                      } while ((ulong)uVar80 * 0xe != lVar99);
                      *(int *)((long)local_420 + (long)(int)uVar116 * 4) =
                           (int)local_238[0].data - iVar78;
                      bVar91 = true;
                      iVar95 = (int)local_238[0].data;
                      bVar64 = false;
                    } while (bVar98);
                    if (local_450 != (ImFontConfig *)0x0) {
                      lVar111 = 0;
                      lVar99 = 0;
                      do {
                        lVar99 = (long)(int)lVar99 + (long)*(int *)((long)local_420 + lVar111 * 4);
                        lVar111 = lVar111 + 1;
                      } while (CONCAT44(uVar170,uVar76) != lVar111);
                      local_438 = (stbtt__edge *)ImGui::MemAlloc(lVar99 * 0x14 + 0x14);
                      if (local_438 != (stbtt__edge *)0x0) {
                        lVar111 = 0;
                        uVar80 = 0;
                        iVar95 = 0;
                        do {
                          iVar78 = *(int *)((long)local_420 + lVar111 * 4);
                          if (0 < iVar78) {
                            lVar99 = (long)iVar95;
                            uVar96 = (ulong)(iVar78 - 1);
                            uVar81 = 0;
                            iVar79 = iVar78;
                            do {
                              iVar113 = (int)uVar96;
                              fVar130 = *(float *)(local_450->Name +
                                                  (long)iVar113 * 8 + lVar99 * 8 + -0x50);
                              fVar103 = *(float *)(pIVar101->Name + uVar81 * 8 + lVar99 * 8 + -0x50)
                              ;
                              if ((fVar130 != fVar103) || (NAN(fVar130) || NAN(fVar103))) {
                                iVar114 = (int)uVar81;
                                iVar79 = iVar113;
                                if (fVar130 <= fVar103) {
                                  iVar79 = iVar114;
                                  iVar114 = iVar113;
                                }
                                local_438[(int)uVar80].invert = (uint)(fVar103 < fVar130);
                                uVar172 = *(undefined8 *)
                                           (local_450->Name + (long)iVar79 * 8 + lVar99 * 8 + -0x54)
                                ;
                                uVar191 = *(undefined8 *)
                                           (local_450->Name + (long)iVar114 * 8 + lVar99 * 8 + -0x54
                                           );
                                psVar106 = local_438 + (int)uVar80;
                                psVar106->x0 = (float)uVar172 * (float)local_248._0_4_ + 0.0;
                                psVar106->y0 = (float)((ulong)uVar172 >> 0x20) *
                                               (float)local_248._4_4_ + 0.0;
                                psVar106->x1 = (float)uVar191 * fStack_240 + 0.0;
                                psVar106->y1 = (float)((ulong)uVar191 >> 0x20) * fStack_23c + 0.0;
                                uVar80 = uVar80 + 1;
                                iVar79 = *(int *)((long)local_420 + lVar111 * 4);
                              }
                              uVar96 = uVar81 & 0xffffffff;
                              uVar81 = uVar81 + 1;
                            } while ((long)uVar81 < (long)iVar79);
                          }
                          iVar95 = iVar95 + iVar78;
                          lVar111 = lVar111 + 1;
                        } while (lVar111 != CONCAT44(uVar170,uVar76));
                        stbtt__sort_edges_quicksort(local_438,uVar80);
                        if (1 < (int)uVar80) {
                          uVar81 = 1;
                          lVar111 = 2;
                          psVar106 = local_438;
                          do {
                            uVar2 = local_438[uVar81].x0;
                            uVar3 = local_438[uVar81].y0;
                            iVar95 = local_438[uVar81].invert;
                            local_238[0].cursor = iVar95;
                            local_238[0].data = *(uchar **)&local_438[uVar81].x1;
                            lVar99 = lVar111;
                            psVar112 = psVar106;
                            do {
                              if (psVar112->y0 <= (float)uVar3) {
                                uVar76 = (int)lVar99 - 1;
                                goto LAB_00157369;
                              }
                              psVar112[1].invert = psVar112->invert;
                              fVar130 = psVar112->y0;
                              fVar103 = psVar112->x1;
                              fVar156 = psVar112->y1;
                              psVar112[1].x0 = psVar112->x0;
                              psVar112[1].y0 = fVar130;
                              psVar112[1].x1 = fVar103;
                              psVar112[1].y1 = fVar156;
                              lVar99 = lVar99 + -1;
                              psVar112 = psVar112 + -1;
                            } while (1 < lVar99);
                            uVar76 = 0;
LAB_00157369:
                            if (uVar81 != uVar76) {
                              local_438[(int)uVar76].x0 = (float)uVar2;
                              local_438[(int)uVar76].y0 = (float)uVar3;
                              *(uchar **)&local_438[(int)uVar76].x1 = local_238[0].data;
                              local_438[(int)uVar76].invert = iVar95;
                            }
                            uVar81 = uVar81 + 1;
                            lVar111 = lVar111 + 1;
                            psVar106 = psVar106 + 1;
                          } while (uVar81 != uVar80);
                        }
                        local_448 = (undefined1  [8])0x0;
                        scanline = local_238;
                        if (0x3f < (int)(uint)local_428) {
                          scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3fc * 8 + 4);
                        }
                        local_438[(int)uVar80].y0 = (float)(iVar77 + local_404) + 1.0;
                        if ((uint)local_3d0 < 0x7fffffff) {
                          local_300 = (long)(int)local_3fc;
                          local_35c = (float)(int)local_498._0_4_;
                          local_370 = (float *)((long)&scanline->data + local_300 * 4);
                          local_328 = local_370 + 1;
                          local_2f0 = local_300 * 4;
                          local_2f8 = (long)(int)(uint)local_428 * 4 + 8;
                          local_400 = (float)(int)local_3fc;
                          local_388 = 0;
                          local_380 = 0;
                          local_3b0 = (undefined8 *)0x0;
                          local_3c8 = 0;
                          local_418 = (stbtt__active_edge *)0x0;
                          auVar87 = (undefined1  [8])(stbtt__active_edge *)0x0;
                          psVar106 = local_438;
                          iVar77 = local_404;
                          do {
                            local_368 = iVar77;
                            iVar77 = local_404;
                            fVar130 = (float)local_368;
                            fVar103 = fVar130 + 1.0;
                            memset(scanline,0,local_2f0);
                            memset(local_370,0,local_2f8);
                            if (auVar87 != (undefined1  [8])0x0) {
                              psVar89 = (stbtt__active_edge *)local_448;
                              do {
                                if (((stbtt__active_edge *)auVar87)->ey <= fVar130) {
                                  psVar89->next = ((stbtt__active_edge *)auVar87)->next;
                                  if ((((stbtt__active_edge *)auVar87)->direction == 0.0) &&
                                     (!NAN(((stbtt__active_edge *)auVar87)->direction))) {
                                    __assert_fail("z->direction",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                                                  ,0xc63,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  ((stbtt__active_edge *)auVar87)->direction = 0.0;
                                  ((stbtt__active_edge *)auVar87)->next = local_418;
                                  local_418 = (stbtt__active_edge *)auVar87;
                                  auVar87 = (undefined1  [8])psVar89;
                                }
                                ppsVar63 = &((stbtt__active_edge *)auVar87)->next;
                                psVar89 = (stbtt__active_edge *)auVar87;
                                auVar87 = (undefined1  [8])*ppsVar63;
                              } while (*ppsVar63 != (stbtt__active_edge *)0x0);
                            }
                            fVar156 = psVar106->y0;
                            if (fVar156 <= fVar103) {
                              bVar64 = (int)local_380 == 0;
                              do {
                                psVar89 = local_418;
                                fVar157 = psVar106->y1;
                                if ((fVar156 != fVar157) || (NAN(fVar156) || NAN(fVar157))) {
                                  if (local_418 == (stbtt__active_edge *)0x0) {
                                    if (local_3c8 == 0) {
                                      puVar88 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar88 == (undefined8 *)0x0) {
                                        __assert_fail("z != __null",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                                                  ,0xad1,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                  );
                                      }
                                      *puVar88 = local_3b0;
                                      fVar156 = psVar106->y0;
                                      fVar157 = psVar106->y1;
                                      local_3c8 = 799;
                                    }
                                    else {
                                      local_3c8 = local_3c8 + -1;
                                      puVar88 = local_3b0;
                                    }
                                    local_3b0 = puVar88;
                                    psVar89 = (stbtt__active_edge *)
                                              (puVar88 + (long)local_3c8 * 4 + 1);
                                    local_418 = (stbtt__active_edge *)0x0;
                                  }
                                  else {
                                    local_418 = local_418->next;
                                  }
                                  fVar158 = psVar106->x0;
                                  fVar159 = (psVar106->x1 - fVar158) / (fVar157 - fVar156);
                                  psVar89->fdx = fVar159;
                                  psVar89->fdy = (float)(-(uint)(fVar159 != 0.0) &
                                                        (uint)(1.0 / fVar159));
                                  psVar89->fx = ((fVar130 - fVar156) * fVar159 + fVar158) -
                                                local_35c;
                                  psVar89->direction =
                                       *(float *)(&DAT_00192678 + (ulong)(psVar106->invert == 0) * 4
                                                 );
                                  psVar89->sy = fVar156;
                                  psVar89->ey = fVar157;
                                  psVar89->next = (stbtt__active_edge *)0x0;
                                  if (fVar157 < fVar130 && (bVar64 && iVar77 != 0)) {
                                    psVar89->ey = fVar130;
                                    fVar157 = fVar130;
                                  }
                                  if (fVar157 < fVar130) {
                                    __assert_fail("z->ey >= scan_y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                                                  ,0xc76,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  psVar89->next = (stbtt__active_edge *)local_448;
                                  local_448 = (undefined1  [8])psVar89;
                                }
                                else {
                                }
                                fVar156 = psVar106[1].y0;
                                psVar106 = psVar106 + 1;
                              } while (fVar156 <= fVar103);
                            }
                            if (local_448 != (undefined1  [8])0x0) {
                              local_2c8 = psVar106;
                              auVar87 = local_448;
                              do {
                                fVar156 = ((stbtt__active_edge *)auVar87)->ey;
                                if (fVar156 < fVar130) {
                                  __assert_fail("e->ey >= y_top",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                                                ,0xba5,
                                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                               );
                                }
                                fVar157 = ((stbtt__active_edge *)auVar87)->fx;
                                auVar202._0_8_ = CONCAT44(0,fVar157);
                                auVar202._8_8_ = 0;
                                fVar158 = ((stbtt__active_edge *)auVar87)->fdx;
                                if ((fVar158 != 0.0) || (NAN(fVar158))) {
                                  fVar159 = ((stbtt__active_edge *)auVar87)->sy;
                                  if (fVar103 < fVar159) {
                                    __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                                                  ,3000,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar166 = fVar158 + fVar157;
                                  fVar164 = (float)(~-(uint)(fVar130 < fVar159) & (uint)fVar157 |
                                                   (uint)((fVar159 - fVar130) * fVar158 + fVar157) &
                                                   -(uint)(fVar130 < fVar159));
                                  if ((((fVar164 < 0.0) ||
                                       (fVar167 = (float)(~-(uint)(fVar156 < fVar103) &
                                                          (uint)fVar166 |
                                                         (uint)((fVar156 - fVar130) * fVar158 +
                                                               fVar157) & -(uint)(fVar156 < fVar103)
                                                         ), fVar167 < 0.0)) ||
                                      (local_400 <= fVar164)) || (local_400 <= fVar167)) {
                                    if ((uint)local_428 < 0x7fffffff) {
                                      local_3e8 = ZEXT416((uint)fVar166);
                                      local_358 = fVar158;
                                      local_348 = auVar202;
                                      uVar80 = 0;
                                      do {
                                        fVar158 = (float)(int)uVar80;
                                        uVar76 = uVar80 + 1;
                                        fVar156 = (float)(int)uVar76;
                                        fVar157 = local_348._0_4_;
                                        fVar159 = (fVar158 - fVar157) / local_358 + fVar130;
                                        fVar164 = (fVar156 - fVar157) / local_358 + fVar130;
                                        fVar166 = local_3e8._0_4_;
                                        if ((fVar158 <= fVar157) || (fVar166 <= fVar156)) {
                                          if ((fVar158 <= fVar166) || (fVar157 <= fVar156)) {
                                            fVar167 = fVar130;
                                            if (((fVar158 <= fVar157) || (fVar166 <= fVar158)) &&
                                               ((fVar158 <= fVar166 || (fVar157 <= fVar158)))) {
                                              if (((fVar157 < fVar156) && (fVar156 < fVar166)) ||
                                                 ((fVar158 = fVar157, fVar159 = fVar130,
                                                  fVar166 < fVar156 && (fVar156 < fVar157)))) {
                                                local_498._0_4_ = fVar156;
                                                fVar158 = fVar130;
                                                fVar159 = fVar164;
                                                goto LAB_001579c0;
                                              }
                                              goto LAB_00157a74;
                                            }
                                          }
                                          else {
                                            local_498._0_4_ = fVar156;
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar80,
                                                       (stbtt__active_edge *)auVar87,fVar157,fVar130
                                                       ,fVar156,fVar164);
                                            fVar157 = (float)local_498._0_4_;
                                            fVar167 = fVar164;
                                          }
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar80,
                                                     (stbtt__active_edge *)auVar87,fVar157,fVar167,
                                                     fVar158,fVar159);
                                        }
                                        else {
                                          local_498._0_4_ = fVar156;
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar80,
                                                     (stbtt__active_edge *)auVar87,fVar157,fVar130,
                                                     fVar158,fVar159);
                                          fVar157 = fVar158;
                                          fVar156 = (float)local_498._0_4_;
                                          fVar158 = fVar159;
                                          fVar159 = fVar164;
LAB_001579c0:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar80,
                                                     (stbtt__active_edge *)auVar87,fVar157,fVar158,
                                                     fVar156,fVar159);
                                          fVar158 = (float)local_498._0_4_;
                                        }
LAB_00157a74:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar80,
                                                   (stbtt__active_edge *)auVar87,fVar158,fVar159,
                                                   local_3e8._0_4_,fVar103);
                                        uVar80 = uVar76;
                                      } while (local_3fc != uVar76);
                                    }
                                  }
                                  else {
                                    if (fVar159 <= fVar130) {
                                      fVar159 = fVar130;
                                    }
                                    uVar80 = (uint)fVar164;
                                    if (fVar103 <= fVar156) {
                                      fVar156 = fVar103;
                                    }
                                    uVar76 = (uint)fVar167;
                                    if (uVar80 == uVar76) {
                                      if (((int)uVar80 < 0) || ((int)(uint)local_428 < (int)uVar80))
                                      {
                                        __assert_fail("x >= 0 && x < len",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar81 = (ulong)uVar80;
                                      *(float *)((long)&scanline->data + uVar81 * 4) =
                                           (((fVar167 - (float)(int)uVar80) +
                                            (fVar164 - (float)(int)uVar80)) * -0.5 + 1.0) *
                                           ((stbtt__active_edge *)auVar87)->direction *
                                           (fVar156 - fVar159) +
                                           *(float *)((long)&scanline->data + uVar81 * 4);
                                      fVar157 = (fVar156 - fVar159) *
                                                ((stbtt__active_edge *)auVar87)->direction;
                                    }
                                    else {
                                      fVar158 = ((stbtt__active_edge *)auVar87)->fdy;
                                      uVar116 = uVar80;
                                      fVar169 = fVar164;
                                      if (fVar167 < fVar164) {
                                        fVar157 = fVar130 - fVar159;
                                        fVar159 = (fVar130 - fVar156) + fVar103;
                                        fVar158 = -fVar158;
                                        uVar116 = uVar76;
                                        uVar76 = uVar80;
                                        fVar156 = fVar157 + fVar103;
                                        fVar169 = fVar167;
                                        fVar167 = fVar164;
                                        fVar157 = fVar166;
                                      }
                                      iVar77 = uVar116 + 1;
                                      fVar166 = ((float)iVar77 - fVar157) * fVar158 + fVar130;
                                      fVar157 = ((stbtt__active_edge *)auVar87)->direction;
                                      fVar164 = (fVar166 - fVar159) * fVar157;
                                      lVar111 = (long)(int)uVar116;
                                      *(float *)((long)&scanline->data + lVar111 * 4) =
                                           (((fVar169 - (float)(int)uVar116) + 1.0) * -0.5 + 1.0) *
                                           fVar164 + *(float *)((long)&scanline->data + lVar111 * 4)
                                      ;
                                      if (uVar76 - iVar77 != 0 && iVar77 <= (int)uVar76) {
                                        do {
                                          *(float *)((long)&scanline->data + lVar111 * 4 + 4) =
                                               fVar158 * fVar157 * 0.5 + fVar164 +
                                               *(float *)((long)&scanline->data + lVar111 * 4 + 4);
                                          fVar164 = fVar164 + fVar158 * fVar157;
                                          lVar111 = lVar111 + 1;
                                        } while (uVar76 - 1 != (int)lVar111);
                                      }
                                      if (1.01 < ABS(fVar164)) {
                                        __assert_fail("ImFabs(area) <= 1.01f",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar81 = (ulong)(int)uVar76;
                                      *(float *)((long)&scanline->data + uVar81 * 4) =
                                           (fVar156 -
                                           (fVar158 * (float)(int)(uVar76 - iVar77) + fVar166)) *
                                           (((fVar167 - (float)(int)uVar76) + 0.0) * -0.5 + 1.0) *
                                           fVar157 + fVar164 +
                                           *(float *)((long)&scanline->data + uVar81 * 4);
                                      fVar157 = (fVar156 - fVar159) * fVar157;
                                    }
                                    local_328[uVar81] = fVar157 + local_328[uVar81];
                                  }
                                }
                                else if (fVar157 < local_400) {
                                  if (0.0 <= fVar157) {
                                    local_348 = auVar202;
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,(int)fVar157,
                                               (stbtt__active_edge *)auVar87,fVar157,fVar130,fVar157
                                               ,fVar103);
                                    iVar77 = (int)fVar157 + 1;
                                    auVar138 = local_348;
                                  }
                                  else {
                                    iVar77 = 0;
                                    auVar138._8_8_ = 0;
                                    auVar138._0_8_ = auVar202._0_8_;
                                  }
                                  stbtt__handle_clipped_edge
                                            (local_370,iVar77,(stbtt__active_edge *)auVar87,
                                             auVar138._0_4_,fVar130,auVar138._0_4_,fVar103);
                                }
                                auVar87 = (undefined1  [8])((stbtt__active_edge *)auVar87)->next;
                                psVar106 = local_2c8;
                              } while (auVar87 != (undefined1  [8])0x0);
                            }
                            uVar80 = (uint)DAT_0018d8c0;
                            auVar145._0_12_ = ZEXT812(0x437f0000);
                            auVar145._12_4_ = 0.0;
                            auVar87 = local_448;
                            if ((uint)local_428 < 0x7fffffff) {
                              fVar130 = 0.0;
                              psVar90 = scanline;
                              uVar81 = local_388;
                              lVar111 = local_300;
                              do {
                                fVar130 = fVar130 + *(float *)((long)&psVar90->data + local_300 * 4)
                                ;
                                iVar77 = (int)((float)((uint)(*(float *)&psVar90->data + fVar130) &
                                                      uVar80) * 255.0 + 0.5);
                                if (0xfe < iVar77) {
                                  iVar77 = 0xff;
                                }
                                local_2e8[(int)uVar81] = (uchar)iVar77;
                                uVar81 = (ulong)((int)uVar81 + 1);
                                psVar90 = (stbtt__buf *)((long)&psVar90->data + 4);
                                lVar111 = lVar111 + -1;
                              } while (lVar111 != 0);
                            }
                            for (; auVar87 != (undefined1  [8])0x0;
                                auVar87 = (undefined1  [8])((stbtt__active_edge *)auVar87)->next) {
                              ((stbtt__active_edge *)auVar87)->fx =
                                   ((stbtt__active_edge *)auVar87)->fdx +
                                   ((stbtt__active_edge *)auVar87)->fx;
                            }
                            iVar95 = (int)local_380;
                            local_380 = (ulong)(iVar95 + 1);
                            local_388 = (ulong)(uint)((int)local_388 + (int)local_42c);
                            puVar88 = local_3b0;
                            auVar87 = local_448;
                            iVar77 = local_368 + 1;
                          } while (iVar95 != (uint)local_3d0);
                          while (puVar88 != (undefined8 *)0x0) {
                            puVar11 = (undefined8 *)*puVar88;
                            ImGui::MemFree(puVar88);
                            puVar88 = puVar11;
                          }
                        }
                        pIVar101 = local_450;
                        if (scanline != local_238) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(local_438);
                      }
                      ImGui::MemFree(local_420);
                      ImGui::MemFree(pIVar101);
                    }
                  }
                }
              }
LAB_00157e57:
              ImGui::MemFree((void *)CONCAT44(local_410._4_4_,(stbtt_uint32)local_410));
              uVar81 = (ulong)*(ushort *)(local_378 + 8);
              uVar65 = *(ushort *)(local_378 + 10);
              uVar127 = *(ushort *)(local_378 + 4);
              uVar80 = (uint)uVar127;
              uVar66 = *(ushort *)(local_378 + 6);
              iVar77 = (int)local_470;
              auVar131 = _DAT_00192600;
              fVar130 = (float)local_468._0_4_;
              if (1 < (byte)local_318) {
                local_238[0].data = (uchar *)0x0;
                uVar76 = 0;
                if (uVar66 == 0) {
                  uVar66 = 0;
                }
                else {
                  puVar86 = local_390 +
                            (long)(int)((uint)uVar65 * (int)local_42c) +
                            (ulong)*(ushort *)(local_378 + 8);
                  iVar77 = (uint)uVar127 - local_488._0_4_;
                  uVar80 = iVar77 + 1;
                  uVar81 = (ulong)uVar80;
                  do {
                    uVar96 = local_318;
                    memset(local_238,0,local_318);
                    auVar131 = _DAT_00192600;
                    uVar170 = local_488._0_4_;
                    uVar116 = uVar80;
                    switch((int)uVar96) {
                    case 2:
                      if (iVar77 < 0) {
LAB_00158168:
                        uVar96 = 0;
                        uVar116 = 0;
                      }
                      else {
                        uVar108 = 0;
                        uVar96 = 0;
                        do {
                          bVar118 = puVar86[uVar108];
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 + 2 & 7)) =
                               bVar118;
                          uVar149 = (int)uVar96 + ((uint)bVar118 - (uint)bVar4);
                          uVar96 = (ulong)uVar149;
                          puVar86[uVar108] = (uchar)(uVar149 >> 1);
                          uVar108 = uVar108 + 1;
                        } while (uVar81 != uVar108);
                      }
                      break;
                    case 3:
                      if (iVar77 < 0) goto LAB_00158168;
                      uVar108 = 0;
                      uVar96 = 0;
                      do {
                        bVar118 = puVar86[uVar108];
                        bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 + 3 & 7)) =
                             bVar118;
                        uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                        puVar86[uVar108] = (uchar)(uVar96 / 3);
                        uVar108 = uVar108 + 1;
                      } while (uVar81 != uVar108);
                      break;
                    case 4:
                      if (iVar77 < 0) goto LAB_00158168;
                      uVar108 = 0;
                      uVar96 = 0;
                      do {
                        bVar118 = puVar86[uVar108];
                        uVar107 = (ulong)((uint)uVar108 & 7);
                        bVar4 = *(byte *)((long)&local_238[0].data + uVar107);
                        *(byte *)((long)&local_238[0].data + (uVar107 ^ 4)) = bVar118;
                        uVar149 = (int)uVar96 + ((uint)bVar118 - (uint)bVar4);
                        uVar96 = (ulong)uVar149;
                        puVar86[uVar108] = (uchar)(uVar149 >> 2);
                        uVar108 = uVar108 + 1;
                      } while (uVar81 != uVar108);
                      break;
                    case 5:
                      if (iVar77 < 0) goto LAB_00158168;
                      uVar108 = 0;
                      uVar96 = 0;
                      do {
                        bVar118 = puVar86[uVar108];
                        bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 + 5 & 7)) =
                             bVar118;
                        uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                        puVar86[uVar108] = (uchar)(uVar96 / 5);
                        uVar108 = uVar108 + 1;
                      } while (uVar81 != uVar108);
                      break;
                    default:
                      if (iVar77 < 0) {
                        uVar96 = 0;
                        uVar116 = 0;
                      }
                      else {
                        uVar108 = 0;
                        uVar96 = 0;
                        do {
                          bVar118 = puVar86[uVar108];
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)(uVar170 + (uint)uVar108 & 7))
                               = bVar118;
                          uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                          puVar86[uVar108] = (uchar)(uVar96 / ((ulong)local_488 & 0xffffffff));
                          uVar108 = uVar108 + 1;
                        } while (uVar81 != uVar108);
                      }
                    }
                    if ((int)uVar116 < (int)(uint)uVar127) {
                      uVar108 = (ulong)uVar116;
                      do {
                        if (puVar86[uVar108] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar116 = (int)uVar96 -
                                  (uint)*(byte *)((long)&local_238[0].data +
                                                 (ulong)((uint)uVar108 & 7));
                        uVar96 = (ulong)uVar116;
                        puVar86[uVar108] = (uchar)(uVar116 / (uint)uVar170);
                        uVar108 = uVar108 + 1;
                      } while ((int)uVar108 < (int)(uint)uVar127);
                    }
                    puVar86 = puVar86 + lVar117;
                    uVar76 = uVar76 + 1;
                  } while (uVar76 != uVar66);
                  uVar81 = (ulong)*(ushort *)(local_378 + 8);
                  uVar65 = *(ushort *)(local_378 + 10);
                  uVar80 = (uint)*(ushort *)(local_378 + 4);
                  uVar66 = *(ushort *)(local_378 + 6);
                  iVar77 = (int)local_470;
                  fVar130 = (float)local_468._0_4_;
                }
              }
              sVar105 = (short)uVar81;
              if (1 < (byte)local_320) {
                local_238[0].data = (uchar *)0x0;
                uVar76 = 0;
                if ((short)uVar80 == 0) {
                  uVar80 = 0;
                }
                else {
                  pbVar115 = local_390 + (long)(int)((uint)uVar65 * (int)local_42c) + uVar81;
                  iVar77 = (uint)uVar66 - iVar77;
                  uVar116 = iVar77 + 1;
                  uVar81 = (ulong)uVar116;
                  do {
                    uVar96 = local_320;
                    memset(local_238,0,local_320);
                    auVar131 = _DAT_00192600;
                    uVar149 = uVar116;
                    switch((int)uVar96) {
                    case 2:
                      if (iVar77 < 0) {
LAB_001585e5:
                        uVar96 = 0;
                        uVar149 = 0;
                      }
                      else {
                        uVar108 = 0;
                        uVar96 = 0;
                        pbVar110 = pbVar115;
                        do {
                          bVar118 = *pbVar110;
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 + 2 & 7)) =
                               bVar118;
                          uVar92 = (int)uVar96 + ((uint)bVar118 - (uint)bVar4);
                          uVar96 = (ulong)uVar92;
                          *pbVar110 = (byte)(uVar92 >> 1);
                          uVar108 = uVar108 + 1;
                          pbVar110 = pbVar110 + lVar117;
                        } while (uVar81 != uVar108);
                      }
                      break;
                    case 3:
                      if (iVar77 < 0) goto LAB_001585e5;
                      uVar108 = 0;
                      uVar96 = 0;
                      pbVar110 = pbVar115;
                      do {
                        bVar118 = *pbVar110;
                        bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 + 3 & 7)) =
                             bVar118;
                        uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                        *pbVar110 = (byte)(uVar96 / 3);
                        uVar108 = uVar108 + 1;
                        pbVar110 = pbVar110 + lVar117;
                      } while (uVar81 != uVar108);
                      break;
                    case 4:
                      if (iVar77 < 0) goto LAB_001585e5;
                      uVar108 = 0;
                      uVar96 = 0;
                      pbVar110 = pbVar115;
                      do {
                        bVar118 = *pbVar110;
                        uVar107 = (ulong)((uint)uVar108 & 7);
                        bVar4 = *(byte *)((long)&local_238[0].data + uVar107);
                        *(byte *)((long)&local_238[0].data + (uVar107 ^ 4)) = bVar118;
                        uVar92 = (int)uVar96 + ((uint)bVar118 - (uint)bVar4);
                        uVar96 = (ulong)uVar92;
                        *pbVar110 = (byte)(uVar92 >> 2);
                        uVar108 = uVar108 + 1;
                        pbVar110 = pbVar110 + lVar117;
                      } while (uVar81 != uVar108);
                      break;
                    case 5:
                      if (iVar77 < 0) goto LAB_001585e5;
                      uVar108 = 0;
                      uVar96 = 0;
                      pbVar110 = pbVar115;
                      do {
                        bVar118 = *pbVar110;
                        bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 + 5 & 7)) =
                             bVar118;
                        uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                        *pbVar110 = (byte)(uVar96 / 5);
                        uVar108 = uVar108 + 1;
                        pbVar110 = pbVar110 + lVar117;
                      } while (uVar81 != uVar108);
                      break;
                    default:
                      if (iVar77 < 0) {
                        uVar96 = 0;
                        uVar149 = 0;
                      }
                      else {
                        uVar108 = 0;
                        uVar96 = 0;
                        pbVar110 = pbVar115;
                        do {
                          bVar118 = *pbVar110;
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar108 & 7));
                          *(byte *)((long)&local_238[0].data +
                                   (ulong)((int)local_470 + (uint)uVar108 & 7)) = bVar118;
                          uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                          *pbVar110 = (byte)(uVar96 / (local_470 & 0xffffffff));
                          uVar108 = uVar108 + 1;
                          pbVar110 = pbVar110 + lVar117;
                        } while (uVar81 != uVar108);
                      }
                    }
                    if ((int)uVar149 < (int)(uint)uVar66) {
                      lVar111 = (long)(int)uVar149;
                      pbVar110 = pbVar115 + lVar117 * lVar111;
                      do {
                        if (*pbVar110 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar96 = (ulong)((int)uVar96 -
                                        (uint)*(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)lVar111 & 7)));
                        *pbVar110 = (byte)(uVar96 / (local_470 & 0xffffffff));
                        lVar111 = lVar111 + 1;
                        pbVar110 = pbVar110 + lVar117;
                      } while ((uint)uVar66 != (uint)lVar111);
                    }
                    pbVar115 = pbVar115 + 1;
                    uVar76 = uVar76 + 1;
                  } while (uVar76 != uVar80);
                  sVar105 = *(short *)(local_378 + 8);
                  uVar65 = *(ushort *)(local_378 + 10);
                  uVar80 = (uint)*(ushort *)(local_378 + 4);
                  uVar66 = *(ushort *)(local_378 + 6);
                  fVar130 = (float)local_468._0_4_;
                }
              }
              *local_2d8 = sVar105;
              local_2d8[1] = uVar65;
              local_2d8[2] = sVar105 + (short)uVar80;
              local_2d8[3] = uVar66 + uVar65;
              *(float *)(local_2d8 + 8) =
                   (float)(int)(short)((short)(local_360 << 8) + (short)local_364) * fVar130;
              *(ulong *)(local_2d8 + 4) =
                   CONCAT44((float)local_354 * local_268._4_4_ + local_258._4_4_,
                            (float)local_350 * local_268._0_4_ + local_258._0_4_);
              *(float *)(local_2d8 + 10) =
                   (float)(int)(uVar80 + local_350) * local_268._0_4_ + local_258._0_4_;
              *(float *)(local_2d8 + 0xc) =
                   (float)(int)((uint)uVar66 + local_354) * (float)local_278._0_4_ +
                   (float)local_288._0_4_;
              iVar77 = local_3b8[1].fontstart;
              lVar111 = local_2e0;
              lVar99 = local_2d0;
              atlas_00 = local_478;
              psVar100 = local_3b8;
            }
            lVar99 = lVar99 + 1;
          } while (lVar99 < iVar77);
        }
        fVar130 = local_308[local_3c0].RasterizerMultiply;
        _local_488 = ZEXT416((uint)fVar130);
        if ((fVar130 != 1.0) || (NAN(fVar130))) {
          local_488._4_4_ = fVar130;
          local_488._0_4_ = fVar130;
          fStack_480 = fVar130;
          fStack_47c = fVar130;
          lVar111 = 0;
          uVar80 = 0xc;
          uVar76 = 0xd;
          uVar116 = 0xe;
          uVar149 = 0xf;
          auVar134 = _DAT_00192590;
          auVar139 = _DAT_00192580;
          auVar146 = _DAT_00192570;
          do {
            uVar137 = auVar139._0_4_;
            uVar141 = auVar139._4_4_;
            uVar142 = auVar139._12_4_;
            uVar165 = auVar139._8_4_;
            uVar92 = auVar134._0_4_;
            uVar135 = auVar134._4_4_;
            uVar136 = auVar134._12_4_;
            uVar178 = auVar134._8_4_;
            uVar143 = auVar146._0_4_;
            uVar147 = auVar146._4_4_;
            uVar148 = auVar146._12_4_;
            uVar198 = auVar146._8_4_;
            fVar181 = (((float)(uVar143 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar143 & 0xffff | 0x4b000000)) * fVar130;
            fVar185 = (((float)(uVar147 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar147 & 0xffff | 0x4b000000)) * fVar130;
            fVar186 = (((float)(uVar198 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar198 & 0xffff | 0x4b000000)) * fVar130;
            fVar187 = (((float)(uVar148 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar148 & 0xffff | 0x4b000000)) * fVar130;
            fVar169 = (((float)(uVar80 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar80 & 0xffff | 0x4b000000)) * fVar130;
            fVar177 = (((float)(uVar76 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar76 & 0xffff | 0x4b000000)) * fVar130;
            fVar179 = (((float)(uVar116 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar116 & 0xffff | 0x4b000000)) * fVar130;
            fVar180 = (((float)(uVar149 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar149 & 0xffff | 0x4b000000)) * fVar130;
            fVar159 = (((float)(uVar92 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar92 & 0xffff | 0x4b000000)) * fVar130;
            fVar164 = (((float)(uVar135 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar135 & 0xffff | 0x4b000000)) * fVar130;
            fVar166 = (((float)(uVar178 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar178 & 0xffff | 0x4b000000)) * fVar130;
            fVar167 = (((float)(uVar136 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar136 & 0xffff | 0x4b000000)) * fVar130;
            fVar103 = (((float)(uVar137 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar137 & 0xffff | 0x4b000000)) * fVar130;
            fVar156 = (((float)(uVar141 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar141 & 0xffff | 0x4b000000)) * fVar130;
            fVar157 = (((float)(uVar165 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar165 & 0xffff | 0x4b000000)) * fVar130;
            fVar158 = (((float)(uVar142 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar142 & 0xffff | 0x4b000000)) * fVar130;
            auVar155._0_4_ = (int)fVar103;
            auVar155._4_4_ = (int)fVar156;
            auVar155._8_4_ = (int)fVar157;
            auVar155._12_4_ = (int)fVar158;
            auVar199._0_4_ = auVar155._0_4_ >> 0x1f;
            auVar199._4_4_ = auVar155._4_4_ >> 0x1f;
            auVar199._8_4_ = auVar155._8_4_ >> 0x1f;
            auVar199._12_4_ = auVar155._12_4_ >> 0x1f;
            auVar154._0_4_ = (int)(fVar103 - 2.1474836e+09);
            auVar154._4_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar154._8_4_ = (int)(fVar157 - 2.1474836e+09);
            auVar154._12_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar155 = auVar154 & auVar199 | auVar155;
            auVar163._0_4_ = (int)fVar159;
            auVar163._4_4_ = (int)fVar164;
            auVar163._8_4_ = (int)fVar166;
            auVar163._12_4_ = (int)fVar167;
            auVar200._0_4_ = auVar163._0_4_ >> 0x1f;
            auVar200._4_4_ = auVar163._4_4_ >> 0x1f;
            auVar200._8_4_ = auVar163._8_4_ >> 0x1f;
            auVar200._12_4_ = auVar163._12_4_ >> 0x1f;
            auVar162._0_4_ = (int)(fVar159 - 2.1474836e+09);
            auVar162._4_4_ = (int)(fVar164 - 2.1474836e+09);
            auVar162._8_4_ = (int)(fVar166 - 2.1474836e+09);
            auVar162._12_4_ = (int)(fVar167 - 2.1474836e+09);
            auVar163 = auVar162 & auVar200 | auVar163;
            auVar195._0_4_ = (int)fVar169;
            auVar195._4_4_ = (int)fVar177;
            auVar195._8_4_ = (int)fVar179;
            auVar195._12_4_ = (int)fVar180;
            auVar204._0_4_ = auVar195._0_4_ >> 0x1f;
            auVar204._4_4_ = auVar195._4_4_ >> 0x1f;
            auVar204._8_4_ = auVar195._8_4_ >> 0x1f;
            auVar204._12_4_ = auVar195._12_4_ >> 0x1f;
            auVar194._0_4_ = (int)(fVar169 - 2.1474836e+09);
            auVar194._4_4_ = (int)(fVar177 - 2.1474836e+09);
            auVar194._8_4_ = (int)(fVar179 - 2.1474836e+09);
            auVar194._12_4_ = (int)(fVar180 - 2.1474836e+09);
            auVar195 = auVar194 & auVar204 | auVar195;
            auVar183._0_4_ = (int)fVar181;
            auVar183._4_4_ = (int)fVar185;
            auVar183._8_4_ = (int)fVar186;
            auVar183._12_4_ = (int)fVar187;
            auVar201._0_4_ = auVar183._0_4_ >> 0x1f;
            auVar201._4_4_ = auVar183._4_4_ >> 0x1f;
            auVar201._8_4_ = auVar183._8_4_ >> 0x1f;
            auVar201._12_4_ = auVar183._12_4_ >> 0x1f;
            auVar182._0_4_ = (int)(fVar181 - 2.1474836e+09);
            auVar182._4_4_ = (int)(fVar185 - 2.1474836e+09);
            auVar182._8_4_ = (int)(fVar186 - 2.1474836e+09);
            auVar182._12_4_ = (int)(fVar187 - 2.1474836e+09);
            auVar183 = auVar182 & auVar201 | auVar183;
            auVar202 = auVar183 ^ _DAT_0018d860;
            auVar175._0_4_ = -(uint)(auVar202._0_4_ < -0x7fffff01);
            auVar175._4_4_ = -(uint)(auVar202._4_4_ < -0x7fffff01);
            auVar175._8_4_ = -(uint)(auVar202._8_4_ < -0x7fffff01);
            auVar175._12_4_ = -(uint)(auVar202._12_4_ < -0x7fffff01);
            auVar202 = ~auVar175 & auVar131 | auVar183 & auVar175;
            auVar133 = auVar195 ^ _DAT_0018d860;
            auVar203._0_4_ = -(uint)(auVar133._0_4_ < -0x7fffff01);
            auVar203._4_4_ = -(uint)(auVar133._4_4_ < -0x7fffff01);
            auVar203._8_4_ = -(uint)(auVar133._8_4_ < -0x7fffff01);
            auVar203._12_4_ = -(uint)(auVar133._12_4_ < -0x7fffff01);
            auVar133 = ~auVar203 & auVar131 | auVar195 & auVar203;
            sVar105 = auVar202._0_2_;
            cVar14 = (0 < sVar105) * (sVar105 < 0x100) * auVar202[0] - (0xff < sVar105);
            sVar105 = auVar202._2_2_;
            sVar168 = CONCAT11((0 < sVar105) * (sVar105 < 0x100) * auVar202[2] - (0xff < sVar105),
                               cVar14);
            sVar105 = auVar202._4_2_;
            cVar125 = (0 < sVar105) * (sVar105 < 0x100) * auVar202[4] - (0xff < sVar105);
            sVar105 = auVar202._6_2_;
            uVar170 = CONCAT13((0 < sVar105) * (sVar105 < 0x100) * auVar202[6] - (0xff < sVar105),
                               CONCAT12(cVar125,sVar168));
            sVar105 = auVar202._8_2_;
            cVar15 = (0 < sVar105) * (sVar105 < 0x100) * auVar202[8] - (0xff < sVar105);
            sVar105 = auVar202._10_2_;
            uVar171 = CONCAT15((0 < sVar105) * (sVar105 < 0x100) * auVar202[10] - (0xff < sVar105),
                               CONCAT14(cVar15,uVar170));
            sVar105 = auVar202._12_2_;
            cVar16 = (0 < sVar105) * (sVar105 < 0x100) * auVar202[0xc] - (0xff < sVar105);
            sVar105 = auVar202._14_2_;
            uVar172 = CONCAT17((0 < sVar105) * (sVar105 < 0x100) * auVar202[0xe] - (0xff < sVar105),
                               CONCAT16(cVar16,uVar171));
            sVar105 = auVar133._0_2_;
            cVar17 = (0 < sVar105) * (sVar105 < 0x100) * auVar133[0] - (0xff < sVar105);
            sVar105 = auVar133._2_2_;
            auVar173._0_10_ =
                 CONCAT19((0 < sVar105) * (sVar105 < 0x100) * auVar133[2] - (0xff < sVar105),
                          CONCAT18(cVar17,uVar172));
            sVar105 = auVar133._4_2_;
            cVar18 = (0 < sVar105) * (sVar105 < 0x100) * auVar133[4] - (0xff < sVar105);
            auVar173[10] = cVar18;
            sVar105 = auVar133._6_2_;
            auVar173[0xb] = (0 < sVar105) * (sVar105 < 0x100) * auVar133[6] - (0xff < sVar105);
            sVar105 = auVar133._8_2_;
            cVar128 = (0 < sVar105) * (sVar105 < 0x100) * auVar133[8] - (0xff < sVar105);
            auVar174[0xc] = cVar128;
            auVar174._0_12_ = auVar173;
            sVar105 = auVar133._10_2_;
            auVar174[0xd] = (0 < sVar105) * (sVar105 < 0x100) * auVar133[10] - (0xff < sVar105);
            sVar105 = auVar133._12_2_;
            cVar126 = (0 < sVar105) * (sVar105 < 0x100) * auVar133[0xc] - (0xff < sVar105);
            auVar176[0xe] = cVar126;
            auVar176._0_14_ = auVar174;
            sVar105 = auVar133._14_2_;
            auVar176[0xf] = (0 < sVar105) * (sVar105 < 0x100) * auVar133[0xe] - (0xff < sVar105);
            auVar202 = auVar163 ^ _DAT_0018d860;
            auVar196._0_4_ = -(uint)(auVar202._0_4_ < -0x7fffff01);
            auVar196._4_4_ = -(uint)(auVar202._4_4_ < -0x7fffff01);
            auVar196._8_4_ = -(uint)(auVar202._8_4_ < -0x7fffff01);
            auVar196._12_4_ = -(uint)(auVar202._12_4_ < -0x7fffff01);
            auVar133 = ~auVar196 & auVar131 | auVar163 & auVar196;
            auVar202 = auVar155 ^ _DAT_0018d860;
            auVar184._0_4_ = -(uint)(auVar202._0_4_ < -0x7fffff01);
            auVar184._4_4_ = -(uint)(auVar202._4_4_ < -0x7fffff01);
            auVar184._8_4_ = -(uint)(auVar202._8_4_ < -0x7fffff01);
            auVar184._12_4_ = -(uint)(auVar202._12_4_ < -0x7fffff01);
            auVar202 = ~auVar184 & auVar131 | auVar155 & auVar184;
            sVar105 = auVar133._0_2_;
            cVar19 = (0 < sVar105) * (sVar105 < 0x100) * auVar133[0] - (0xff < sVar105);
            sVar105 = auVar133._2_2_;
            sVar188 = CONCAT11((0 < sVar105) * (sVar105 < 0x100) * auVar133[2] - (0xff < sVar105),
                               cVar19);
            sVar105 = auVar133._4_2_;
            cVar20 = (0 < sVar105) * (sVar105 < 0x100) * auVar133[4] - (0xff < sVar105);
            sVar105 = auVar133._6_2_;
            uVar189 = CONCAT13((0 < sVar105) * (sVar105 < 0x100) * auVar133[6] - (0xff < sVar105),
                               CONCAT12(cVar20,sVar188));
            sVar105 = auVar133._8_2_;
            cVar21 = (0 < sVar105) * (sVar105 < 0x100) * auVar133[8] - (0xff < sVar105);
            sVar105 = auVar133._10_2_;
            uVar190 = CONCAT15((0 < sVar105) * (sVar105 < 0x100) * auVar133[10] - (0xff < sVar105),
                               CONCAT14(cVar21,uVar189));
            sVar105 = auVar133._12_2_;
            cVar22 = (0 < sVar105) * (sVar105 < 0x100) * auVar133[0xc] - (0xff < sVar105);
            sVar105 = auVar133._14_2_;
            uVar191 = CONCAT17((0 < sVar105) * (sVar105 < 0x100) * auVar133[0xe] - (0xff < sVar105),
                               CONCAT16(cVar22,uVar190));
            sVar105 = auVar202._0_2_;
            cVar23 = (0 < sVar105) * (sVar105 < 0x100) * auVar202[0] - (0xff < sVar105);
            sVar105 = auVar202._2_2_;
            auVar192._0_10_ =
                 CONCAT19((0 < sVar105) * (sVar105 < 0x100) * auVar202[2] - (0xff < sVar105),
                          CONCAT18(cVar23,uVar191));
            sVar105 = auVar202._4_2_;
            cVar24 = (0 < sVar105) * (sVar105 < 0x100) * auVar202[4] - (0xff < sVar105);
            auVar192[10] = cVar24;
            sVar105 = auVar202._6_2_;
            auVar192[0xb] = (0 < sVar105) * (sVar105 < 0x100) * auVar202[6] - (0xff < sVar105);
            sVar105 = auVar202._8_2_;
            cVar25 = (0 < sVar105) * (sVar105 < 0x100) * auVar202[8] - (0xff < sVar105);
            auVar193[0xc] = cVar25;
            auVar193._0_12_ = auVar192;
            sVar105 = auVar202._10_2_;
            auVar193[0xd] = (0 < sVar105) * (sVar105 < 0x100) * auVar202[10] - (0xff < sVar105);
            sVar105 = auVar202._12_2_;
            cVar26 = (0 < sVar105) * (sVar105 < 0x100) * auVar202[0xc] - (0xff < sVar105);
            auVar197[0xe] = cVar26;
            auVar197._0_14_ = auVar193;
            sVar105 = auVar202._14_2_;
            auVar197[0xf] = (0 < sVar105) * (sVar105 < 0x100) * auVar202[0xe] - (0xff < sVar105);
            sVar105 = (short)((uint)uVar189 >> 0x10);
            sVar67 = (short)((uint6)uVar190 >> 0x20);
            sVar129 = (short)((ulong)uVar191 >> 0x30);
            sVar27 = (short)((unkuint10)auVar192._0_10_ >> 0x40);
            sVar28 = auVar192._10_2_;
            sVar29 = auVar193._12_2_;
            sVar30 = auVar197._14_2_;
            sVar31 = (short)((uint)uVar170 >> 0x10);
            sVar32 = (short)((uint6)uVar171 >> 0x20);
            sVar33 = (short)((ulong)uVar172 >> 0x30);
            sVar34 = (short)((unkuint10)auVar173._0_10_ >> 0x40);
            sVar35 = auVar173._10_2_;
            sVar36 = auVar174._12_2_;
            sVar37 = auVar176._14_2_;
            *(char *)((long)&local_238[0].data + lVar111) =
                 (0 < sVar188) * (sVar188 < 0x100) * cVar19 - (0xff < sVar188);
            *(char *)((long)&local_238[0].data + lVar111 + 1) =
                 (0 < sVar105) * (sVar105 < 0x100) * cVar20 - (0xff < sVar105);
            *(char *)((long)&local_238[0].data + lVar111 + 2) =
                 (0 < sVar67) * (sVar67 < 0x100) * cVar21 - (0xff < sVar67);
            *(char *)((long)&local_238[0].data + lVar111 + 3) =
                 (0 < sVar129) * (sVar129 < 0x100) * cVar22 - (0xff < sVar129);
            *(char *)((long)&local_238[0].data + lVar111 + 4) =
                 (0 < sVar27) * (sVar27 < 0x100) * cVar23 - (0xff < sVar27);
            *(char *)((long)&local_238[0].data + lVar111 + 5) =
                 (0 < sVar28) * (sVar28 < 0x100) * cVar24 - (0xff < sVar28);
            *(char *)((long)&local_238[0].data + lVar111 + 6) =
                 (0 < sVar29) * (sVar29 < 0x100) * cVar25 - (0xff < sVar29);
            *(char *)((long)&local_238[0].data + lVar111 + 7) =
                 (0 < sVar30) * (sVar30 < 0x100) * cVar26 - (0xff < sVar30);
            *(char *)((long)&local_238[0].cursor + lVar111) =
                 (0 < sVar168) * (sVar168 < 0x100) * cVar14 - (0xff < sVar168);
            *(char *)((long)&local_238[0].cursor + lVar111 + 1) =
                 (0 < sVar31) * (sVar31 < 0x100) * cVar125 - (0xff < sVar31);
            *(char *)((long)&local_238[0].cursor + lVar111 + 2) =
                 (0 < sVar32) * (sVar32 < 0x100) * cVar15 - (0xff < sVar32);
            *(char *)((long)&local_238[0].cursor + lVar111 + 3) =
                 (0 < sVar33) * (sVar33 < 0x100) * cVar16 - (0xff < sVar33);
            *(char *)((long)&local_238[0].size + lVar111) =
                 (0 < sVar34) * (sVar34 < 0x100) * cVar17 - (0xff < sVar34);
            *(char *)((long)&local_238[0].size + lVar111 + 1) =
                 (0 < sVar35) * (sVar35 < 0x100) * cVar18 - (0xff < sVar35);
            *(char *)((long)&local_238[0].size + lVar111 + 2) =
                 (0 < sVar36) * (sVar36 < 0x100) * cVar128 - (0xff < sVar36);
            *(char *)((long)&local_238[0].size + lVar111 + 3) =
                 (0 < sVar37) * (sVar37 < 0x100) * cVar126 - (0xff < sVar37);
            lVar111 = lVar111 + 0x10;
            iVar77 = (int)DAT_00192610;
            auVar134._0_4_ = uVar92 + iVar77;
            iVar95 = DAT_00192610._4_4_;
            auVar134._4_4_ = uVar135 + iVar95;
            iVar78 = DAT_00192610._8_4_;
            auVar134._8_4_ = uVar178 + iVar78;
            iVar79 = DAT_00192610._12_4_;
            auVar134._12_4_ = uVar136 + iVar79;
            auVar139._0_4_ = uVar137 + iVar77;
            auVar139._4_4_ = uVar141 + iVar95;
            auVar139._8_4_ = uVar165 + iVar78;
            auVar139._12_4_ = uVar142 + iVar79;
            auVar146._0_4_ = uVar143 + iVar77;
            auVar146._4_4_ = uVar147 + iVar95;
            auVar146._8_4_ = uVar198 + iVar78;
            auVar146._12_4_ = uVar148 + iVar79;
            uVar80 = uVar80 + iVar77;
            uVar76 = uVar76 + iVar95;
            uVar116 = uVar116 + iVar78;
            uVar149 = uVar149 + iVar79;
          } while (lVar111 != 0x100);
          iVar77 = psVar100[1].cff.cursor;
          if (0 < iVar77) {
            lVar99._0_4_ = psVar100[1].hmtx;
            lVar99._4_4_ = psVar100[1].kern;
            iVar95 = 0;
            do {
              if ((*(int *)(lVar99 + 0xc) != 0) && (*(ushort *)(lVar99 + 6) != 0)) {
                iVar77 = atlas_00->TexWidth;
                uVar65 = *(ushort *)(lVar99 + 4);
                puVar86 = atlas_00->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar99 + 10) * (long)iVar77 +
                          (ulong)*(ushort *)(lVar99 + 8);
                uVar80 = (uint)*(ushort *)(lVar99 + 6);
                do {
                  if ((ulong)uVar65 != 0) {
                    uVar81 = 0;
                    do {
                      puVar86[uVar81] =
                           *(uchar *)((long)&local_238[0].data + (ulong)puVar86[uVar81]);
                      uVar81 = uVar81 + 1;
                    } while (uVar65 != uVar81);
                  }
                  puVar86 = puVar86 + iVar77;
                  bVar64 = 1 < (int)uVar80;
                  uVar80 = uVar80 - 1;
                } while (bVar64);
                iVar77 = psVar100[1].cff.cursor;
              }
              iVar95 = iVar95 + 1;
              lVar99 = lVar99 + 0x10;
            } while (iVar95 < iVar77);
          }
        }
        psVar100[1].hmtx = 0;
        psVar100[1].kern = 0;
      }
      lVar111 = local_3c0 + 1;
    } while (lVar111 != lVar93);
  }
  ImGui::MemFree(local_440);
  ImGui::MemFree(local_330);
  pvVar85 = pvStack_3f0;
  if (pvStack_3f0 != (void *)0x0) {
    auVar55._8_8_ = 0;
    auVar55._0_8_ = pvStack_3f0;
    _local_3f8 = (stbtt__buf)(auVar55 << 0x40);
    ImGui::MemFree(pvVar85);
    pvStack_3f0._0_4_ = 0;
    pvStack_3f0._4_4_ = 0;
  }
  if (0 < (int)uVar8) {
    lVar111 = 0;
    auVar124._0_12_ = DAT_00192550._0_12_;
    auVar124._12_2_ = DAT_00192550._6_2_;
    auVar124._14_2_ = DAT_00192550._6_2_;
    auVar123._12_4_ = auVar124._12_4_;
    auVar123._0_10_ = (unkbyte10)DAT_00192550;
    auVar123._10_2_ = DAT_00192550._4_2_;
    auVar122._10_6_ = auVar123._10_6_;
    auVar122._0_8_ = (undefined8)DAT_00192550;
    auVar122._8_2_ = DAT_00192550._4_2_;
    local_498._8_8_ = auVar122._8_8_;
    local_498._6_2_ = DAT_00192550._2_2_;
    local_498._4_2_ = DAT_00192550._2_2_;
    local_498._0_2_ = (undefined2)DAT_00192550;
    local_498._2_2_ = local_498._0_2_;
    pvVar85 = __s;
    do {
      lVar117 = lVar111 * 0x110;
      iVar77 = *(int *)((long)pvVar85 + lVar117 + 0xe8);
      __s = pvVar85;
      if (iVar77 != 0) {
        if ((local_478->ConfigData).Size <= lVar111) goto LAB_00159064;
        pIVar12 = (local_478->ConfigData).Data;
        pIVar101 = pIVar12 + lVar111;
        pIVar9 = pIVar12[lVar111].DstFont;
        if (pIVar12[lVar111].MergeMode == true) {
          fVar130 = pIVar9->Ascent;
        }
        else {
          _local_488 = ZEXT416((uint)pIVar12[lVar111].SizePixels);
          lVar99 = *(long *)((long)pvVar85 + lVar117 + 8);
          lVar97 = (long)*(int *)((long)pvVar85 + lVar117 + 0x24);
          bVar118 = *(byte *)(lVar99 + 4 + lVar97);
          bVar4 = *(byte *)(lVar99 + 5 + lVar97);
          bVar5 = *(byte *)(lVar99 + 7 + lVar97);
          bVar6 = *(byte *)(lVar99 + 6 + lVar97);
          ImFont::ClearOutputData(pIVar9);
          iVar77 = (uint)bVar6 * 0x100 + (uint)bVar118;
          auVar44._1_9_ = (unkuint9)0 << 8;
          auVar44[0] = (char)((uint)iVar77 >> 0x10);
          auVar44._10_6_ = 0;
          auVar59._1_12_ = SUB1612(auVar44 << 0x28,4);
          auVar59[0] = (char)((uint)iVar77 >> 8);
          auVar59[0xd] = 0;
          auVar60._1_14_ = auVar59 << 8;
          auVar60[0] = (char)iVar77;
          auVar60[0xf] = 0;
          auVar131 = ZEXT416((uint)bVar4 | (uint)bVar5 << 0x10) | auVar60 << 8;
          sVar67 = auVar131._0_2_;
          sVar105 = auVar131._2_2_;
          fVar103 = (float)((int)sVar67 - (int)sVar105);
          sVar129 = auVar131._4_2_;
          auVar61._4_6_ = 0;
          auVar61._0_4_ = fVar103;
          auVar61._10_2_ = sVar129;
          auVar62._8_4_ = auVar61._8_4_;
          auVar62._6_2_ = sVar105;
          auVar62._4_2_ = (short)((uint)fVar103 >> 0x10);
          auVar62._0_4_ = fVar103;
          auVar140._0_2_ = -(ushort)(sVar67 < (short)local_498._0_2_);
          auVar140._2_2_ = -(ushort)(sVar67 < (short)local_498._2_2_);
          auVar140._4_2_ = -(ushort)(sVar105 < (short)local_498._4_2_);
          auVar140._6_2_ = -(ushort)(sVar105 < (short)local_498._6_2_);
          auVar140._8_2_ = -(ushort)(sVar129 < (short)local_498._8_2_);
          auVar140._10_2_ = -(ushort)(sVar129 < (short)local_498._10_2_);
          auVar140._12_2_ = -(ushort)(0 < (short)local_498._12_2_);
          auVar140._14_2_ = -(ushort)(0 < (short)local_498._14_2_);
          auVar131 = auVar140 & _DAT_0018d910 | ~auVar140 & _DAT_0018d890;
          fVar130 = (float)(int)(((float)local_488._0_4_ / fVar103) * (float)(int)sVar67 +
                                auVar131._0_4_);
          pIVar9->FontSize = pIVar101->SizePixels;
          pIVar9->ConfigData = pIVar101;
          pIVar9->ContainerAtlas = local_478;
          pIVar9->Ascent = fVar130;
          pIVar9->Descent =
               (float)(int)(((float)local_488._0_4_ / fVar103) * (float)(auVar62._4_4_ >> 0x10) +
                           auVar131._4_4_);
          iVar77 = *(int *)((long)pvVar85 + lVar117 + 0xe8);
        }
        pIVar9->ConfigDataCount = pIVar9->ConfigDataCount + 1;
        if (0 < iVar77) {
          local_488._0_4_ = (pIVar101->GlyphOffset).x;
          fVar130 = (float)(int)(fVar130 + 0.5) + (pIVar101->GlyphOffset).y;
          lVar97 = 0;
          lVar99 = 0;
          do {
            if (*(int *)((long)pvVar85 + lVar117 + 0x100) <= lVar99) goto LAB_00158faa;
            lVar13 = *(long *)((long)pvVar85 + lVar117 + 0xd0);
            fVar103 = *(float *)(lVar13 + 0x10 + lVar97);
            fVar156 = pIVar101->GlyphMaxAdvanceX;
            if (fVar103 <= pIVar101->GlyphMaxAdvanceX) {
              fVar156 = fVar103;
            }
            uVar80 = -(uint)(fVar103 < pIVar101->GlyphMinAdvanceX);
            fVar156 = (float)(uVar80 & (uint)pIVar101->GlyphMinAdvanceX | ~uVar80 & (uint)fVar156);
            if ((fVar103 != fVar156) ||
               (fVar157 = (float)local_488._0_4_, NAN(fVar103) || NAN(fVar156))) {
              fVar157 = (fVar156 - fVar103) * 0.5;
              if (pIVar101->PixelSnapH != false) {
                fVar157 = (float)(int)fVar157;
              }
              fVar157 = fVar157 + (float)local_488._0_4_;
            }
            fVar158 = 1.0 / (float)local_478->TexHeight;
            fVar103 = 1.0 / (float)local_478->TexWidth;
            ImFont::AddGlyph(pIVar9,(ImWchar)*(undefined4 *)
                                              (*(long *)((long)pvVar85 + lVar117 + 0x108) +
                                              lVar99 * 4),
                             *(float *)(lVar13 + 8 + lVar97) + 0.0 + fVar157,
                             *(float *)(lVar13 + 0xc + lVar97) + 0.0 + fVar130,
                             *(float *)(lVar13 + 0x14 + lVar97) + 0.0 + fVar157,
                             *(float *)(lVar13 + 0x18 + lVar97) + 0.0 + fVar130,
                             (float)*(ushort *)(lVar13 + lVar97) * fVar103,
                             (float)*(ushort *)(lVar13 + 2 + lVar97) * fVar158,
                             (float)*(ushort *)(lVar13 + 4 + lVar97) * fVar103,
                             (float)*(ushort *)(lVar13 + 6 + lVar97) * fVar158,fVar156);
            lVar99 = lVar99 + 1;
            lVar97 = lVar97 + 0x1c;
          } while (lVar99 < *(int *)((long)pvVar85 + lVar117 + 0xe8));
        }
      }
      atlas_00 = local_478;
      lVar111 = lVar111 + 1;
      pvVar85 = __s;
    } while (lVar111 != lVar93);
    if (0 < (int)uVar8) {
      sVar102 = 0;
      do {
        pvVar85 = *(void **)((long)__s + sVar102 + 0x108);
        if (pvVar85 != (void *)0x0) {
          ImGui::MemFree(pvVar85);
        }
        pvVar85 = *(void **)((long)__s + sVar102 + 0xf8);
        if (pvVar85 != (void *)0x0) {
          ImGui::MemFree(pvVar85);
        }
        sVar102 = sVar102 + 0x110;
      } while (local_310 != sVar102);
    }
  }
  ImFontAtlasBuildFinish(atlas_00);
  if (pvStack_3a0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3a0);
  }
  bVar64 = true;
LAB_00158f2a:
  if (__s != (void *)0x0) {
    ImGui::MemFree(__s);
  }
  return bVar64;
LAB_001590fa:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_00158fbf;
LAB_00159064:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_00158fbf;
LAB_00158faa:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_00158fbf:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                ,0x4d8,__function);
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildRegisterDefaultCustomRects(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Resize(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Resize(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.GetBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint, true);
                dst_tmp.GlyphsSet.SetBit(codepoint, true);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBoolVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096*0.7f) ? 4096 : (surface_sqrt >= 2048*0.7f) ? 2048 : (surface_sqrt >= 1024*0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + (float)(int)(dst_font->Ascent + 0.5f);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];

            const float char_advance_x_org = pc.xadvance;
            const float char_advance_x_mod = ImClamp(char_advance_x_org, cfg.GlyphMinAdvanceX, cfg.GlyphMaxAdvanceX);
            float char_off_x = font_off_x;
            if (char_advance_x_org != char_advance_x_mod)
                char_off_x += cfg.PixelSnapH ? (float)(int)((char_advance_x_mod - char_advance_x_org) * 0.5f) : (char_advance_x_mod - char_advance_x_org) * 0.5f;

            // Register glyph
            stbtt_aligned_quad q;
            float dummy_x = 0.0f, dummy_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &dummy_x, &dummy_y, &q, 0);
            dst_font->AddGlyph((ImWchar)codepoint, q.x0 + char_off_x, q.y0 + font_off_y, q.x1 + char_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, char_advance_x_mod);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}